

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_modinv32_uint16(uint16_t *out,uint16_t *in,uint16_t *mod)

{
  int64_t *piVar1;
  uint *puVar2;
  ushort *puVar3;
  secp256k1_scalar *a;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  int iVar13;
  uint uVar14;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar15;
  uint64_t uVar16;
  long lVar17;
  byte bVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  secp256k1_modinv32_signed30 *b;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  secp256k1_modinv64_modinfo *m_00;
  secp256k1_modinv64_modinfo *psVar23;
  long lVar24;
  secp256k1_modinv32_signed30 *a_00;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar25;
  long lVar26;
  secp256k1_modinv32_signed30 *b_00;
  long *extraout_RDX_01;
  char cVar27;
  uint uVar28;
  uint uVar29;
  secp256k1_modinv64_modinfo *psVar31;
  secp256k1_modinv64_modinfo *psVar32;
  int *piVar33;
  secp256k1_modinv32_signed30 *psVar34;
  ulong unaff_RBP;
  uint64_t uVar35;
  secp256k1_modinv32_signed30 *psVar36;
  secp256k1_fe *psVar37;
  ulong uVar38;
  secp256k1_fe *r;
  uint uVar39;
  uint uVar40;
  secp256k1_modinv64_modinfo *psVar41;
  secp256k1_modinv64_modinfo *psVar42;
  secp256k1_modinv32_signed30 *a_01;
  secp256k1_modinv32_signed30 *a_02;
  long lVar43;
  ulong uVar44;
  secp256k1_fe *r_00;
  secp256k1_fe *psVar45;
  uchar *__s;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  secp256k1_modinv64_modinfo *psVar51;
  int *piVar52;
  uint uVar53;
  secp256k1_modinv64_modinfo *psVar54;
  secp256k1_modinv64_modinfo *psVar55;
  secp256k1_modinv32_signed30 *psVar56;
  uint uVar57;
  uint uVar58;
  code *pcVar59;
  int64_t iVar60;
  secp256k1_modinv64_modinfo *psVar61;
  secp256k1_modinv32_signed30 *psVar62;
  size_t count;
  uint uVar63;
  uint64_t uVar64;
  secp256k1_fe *a_03;
  uint uVar65;
  uint uVar66;
  uint64_t uVar67;
  bool bVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  secp256k1_modinv32_signed30 x;
  secp256k1_modinv32_modinfo m;
  uint16_t tmp [16];
  uint16_t negone [16];
  ulong uStack_1820;
  secp256k1_fe *psStack_1818;
  uchar auStack_1810 [4232];
  secp256k1_fe *psStack_788;
  ulong uStack_780;
  uint64_t uStack_778;
  secp256k1_fe *psStack_770;
  code *pcStack_768;
  code *pcStack_760;
  undefined1 auStack_758 [36];
  int iStack_734;
  int iStack_730;
  int iStack_72c;
  int iStack_728;
  int iStack_724;
  int iStack_720;
  int iStack_71c;
  undefined1 auStack_718 [48];
  code *pcStack_6e8;
  long lStack_6d8;
  secp256k1_fe sStack_6d0;
  secp256k1_fe *psStack_698;
  secp256k1_fe sStack_690;
  secp256k1_fe sStack_660;
  ulong uStack_628;
  ulong uStack_620;
  ulong uStack_618;
  secp256k1_modinv32_signed30 *psStack_610;
  ulong uStack_608;
  code *pcStack_600;
  uint uStack_5f8;
  uint uStack_5f4;
  uint uStack_5f0;
  uint uStack_5ec;
  uint uStack_5e8;
  uint uStack_5e4;
  secp256k1_modinv32_signed30 *psStack_5e0;
  uint uStack_5d4;
  uint uStack_5d0;
  uint uStack_5cc;
  uint uStack_5c8;
  int32_t iStack_5c4;
  secp256k1_modinv32_signed30 *psStack_5c0;
  secp256k1_modinv32_signed30 *psStack_5b8;
  secp256k1_modinv32_signed30 *psStack_5b0;
  secp256k1_modinv32_signed30 *psStack_5a8;
  secp256k1_modinv32_signed30 *psStack_5a0;
  code *pcStack_598;
  long lStack_588;
  long lStack_580;
  int *piStack_578;
  ulong uStack_570;
  secp256k1_modinv64_modinfo *psStack_568;
  secp256k1_modinv64_modinfo *psStack_558;
  code *pcStack_550;
  secp256k1_modinv32_signed30 *psStack_548;
  int *piStack_538;
  ulong uStack_530;
  secp256k1_modinv64_modinfo *psStack_528;
  secp256k1_modinv64_modinfo *psStack_518;
  code *pcStack_510;
  secp256k1_modinv32_signed30 sStack_508;
  secp256k1_modinv32_signed30 sStack_4e4;
  secp256k1_modinv64_modinfo *psStack_4c0;
  secp256k1_modinv64_modinfo *psStack_4b8;
  secp256k1_modinv64_modinfo *psStack_4a8;
  int iStack_49c;
  uint uStack_498;
  uint uStack_494;
  secp256k1_modinv32_trans2x2 sStack_490;
  secp256k1_modinv64_modinfo sStack_480;
  long lStack_450;
  undefined8 uStack_448;
  secp256k1_modinv64_modinfo sStack_440;
  undefined1 auStack_410 [40];
  uint64_t uStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  secp256k1_modinv64_modinfo *psStack_3c8;
  ulong uStack_3c0;
  secp256k1_modinv64_modinfo *psStack_3b8;
  secp256k1_modinv64_modinfo *psStack_3b0;
  secp256k1_modinv64_modinfo *psStack_3a8;
  secp256k1_modinv64_modinfo *psStack_3a0;
  int iStack_394;
  secp256k1_modinv64_modinfo *psStack_390;
  secp256k1_modinv32_trans2x2 sStack_388;
  secp256k1_modinv64_modinfo sStack_378;
  secp256k1_modinv64_modinfo *psStack_348;
  undefined8 uStack_340;
  secp256k1_modinv64_modinfo sStack_338;
  undefined1 auStack_308 [40];
  uint64_t uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  secp256k1_modinv64_modinfo *psStack_2c0;
  secp256k1_modinv64_modinfo *psStack_2b8;
  secp256k1_modinv64_modinfo *psStack_2b0;
  secp256k1_modinv64_modinfo *psStack_2a8;
  secp256k1_modinv64_modinfo *psStack_2a0;
  code *pcStack_298;
  secp256k1_modinv64_modinfo *psStack_290;
  int iStack_288;
  uint uStack_284;
  secp256k1_modinv32_trans2x2 sStack_280;
  secp256k1_modinv64_modinfo sStack_270;
  secp256k1_modinv64_modinfo sStack_240;
  secp256k1_modinv64_modinfo *psStack_210;
  secp256k1_modinv64_modinfo *psStack_208;
  secp256k1_modinv64_modinfo *psStack_200;
  secp256k1_modinv64_modinfo *psStack_1f8;
  secp256k1_modinv64_modinfo *psStack_1f0;
  secp256k1_modinv64_modinfo *psStack_1e8;
  code *pcStack_1e0;
  code *pcStack_1d8;
  secp256k1_modinv64_modinfo sStack_1d0;
  secp256k1_modinv64_modinfo sStack_1a0;
  secp256k1_modinv64_modinfo sStack_170;
  uint16_t uStack_140;
  undefined8 uStack_13e;
  undefined6 uStack_136;
  undefined2 uStack_130;
  undefined6 uStack_12e;
  int64_t iStack_128;
  uint16_t *puStack_118;
  ulong uStack_110;
  code *pcStack_108;
  uint16_t *puStack_100;
  uint16_t *puStack_f8;
  code *pcStack_f0;
  secp256k1_modinv64_modinfo local_e8;
  secp256k1_modinv64_modinfo local_b8;
  secp256k1_modinv64_modinfo local_88;
  uint16_t local_58;
  undefined8 local_56;
  undefined6 uStack_4e;
  undefined2 uStack_48;
  undefined6 uStack_46;
  undefined8 uStack_40;
  secp256k1_modinv64_modinfo *psVar30;
  
  psVar61 = &local_e8;
  psVar42 = &local_e8;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar12 = 0;
  do {
    puVar2 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar12 & 0xff) / 0x1e) * 4);
    *puVar2 = *puVar2 | (uint)((in[uVar12 >> 4] >> (uVar12 & 0xf) & 1) != 0) <<
                        ((char)(uVar12 / 0x1e) * -0x1e + (char)uVar12 & 0x1fU);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0x100);
  uVar57 = local_e8.modulus.v[0]._4_4_ | (uint)local_e8.modulus.v[0] | (uint)local_e8.modulus.v[1] |
           local_e8.modulus.v[1]._4_4_ | (uint)local_e8.modulus.v[2] | local_e8.modulus.v[2]._4_4_ |
           (uint)local_e8.modulus.v[3] | local_e8.modulus.v[3]._4_4_ | (uint)local_e8.modulus.v[4];
  pcVar59 = (code *)(ulong)uVar57;
  local_b8.modulus.v[0] = 0;
  local_b8.modulus.v[1] = 0;
  local_b8.modulus.v[2] = 0;
  local_b8.modulus.v[3] = 0;
  local_b8.modulus.v[4]._0_4_ = 0;
  uVar12 = 0;
  do {
    psVar32 = (secp256k1_modinv64_modinfo *)(ulong)mod[uVar12 >> 4];
    puVar2 = (uint *)((long)local_b8.modulus.v + (ulong)((uVar12 & 0xff) / 0x1e) * 4);
    *puVar2 = *puVar2 | (uint)((mod[uVar12 >> 4] >> (uVar12 & 0xf) & 1) != 0) <<
                        ((char)(uVar12 / 0x1e) * -0x1e + (char)uVar12 & 0x1fU);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0x100);
  iVar13 = (int)local_b8.modulus.v[0];
  psVar54 = (secp256k1_modinv64_modinfo *)(long)(int)local_b8.modulus.v[0];
  pcStack_f0 = (code *)0x1524ae;
  uVar16 = modinv2p64((uint64_t)psVar54);
  local_b8.modulus.v[4]._4_4_ = (uint)uVar16 & 0x3fffffff;
  uVar12 = iVar13 * (uint)uVar16 & 0x3fffffff;
  uVar47 = (ulong)uVar12;
  if (uVar12 != 1) goto LAB_001528ab;
  if (uVar57 == 0) {
LAB_00152610:
    local_e8.modulus.v[2] = 0;
    local_e8.modulus.v[3] = 0;
    local_e8.modulus.v[0] = 0;
    local_e8.modulus.v[1] = 0;
    local_e8.modulus.v[4]._0_4_ = 0;
    uVar12 = 0;
    do {
      puVar2 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar12 & 0xff) / 0x1e) * 4);
      *puVar2 = *puVar2 | (uint)((in[uVar12 >> 4] >> (uVar12 & 0xf) & 1) != 0) <<
                          ((char)(uVar12 / 0x1e) * -0x1e + (char)uVar12 & 0x1fU);
      uVar12 = uVar12 + 1;
    } while (uVar12 != 0x100);
    local_88.modulus_inv62 = (uint64_t)mod;
    iVar13 = 0x10;
    do {
      uVar49 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
      uVar47 = uVar49 >> 0x1d;
      uVar49 = uVar49 >> 0x3d;
      iVar20 = *(int *)((long)local_b8.modulus.v + uVar49 * 4);
      if (iVar20 < 1) {
        if (iVar20 < 0) {
          uVar47 = uVar47 + 0x100000000 >> 0x20;
          uVar12 = *(uint *)((long)local_b8.modulus.v + uVar47 * 4);
          mod = (uint16_t *)(ulong)uVar12;
          if (0x3ffffffe < (int)uVar12) {
            *(int *)((long)local_b8.modulus.v + uVar49 * 4) = iVar20 + 0x40000000;
            uVar12 = uVar12 - 1;
            goto LAB_001526e5;
          }
        }
      }
      else {
        uVar47 = uVar47 + 0x100000000 >> 0x20;
        uVar12 = *(uint *)((long)local_b8.modulus.v + uVar47 * 4);
        mod = (uint16_t *)(ulong)uVar12;
        if ((int)uVar12 < 0x40000000) {
          *(int *)((long)local_b8.modulus.v + uVar49 * 4) = iVar20 + -0x40000000;
          uVar12 = uVar12 + 1;
LAB_001526e5:
          mod = (uint16_t *)(ulong)uVar12;
          *(uint *)((long)local_b8.modulus.v + uVar47 * 4) = uVar12;
        }
      }
      uVar48 = secp256k1_test_state[1] << 0x11;
      uVar49 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar47 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar49;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar47;
      secp256k1_test_state[2] = uVar49 ^ uVar48;
      secp256k1_test_state[3] = uVar47 << 0x2d | uVar47 >> 0x13;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
    unaff_RBP = (ulong)(uVar57 != 0);
    mod = (uint16_t *)CONCAT71((int7)((ulong)mod >> 8),1);
    uVar47 = 0x88888889;
    while( true ) {
      cVar27 = (char)mod;
      pcVar59 = secp256k1_modinv32_var;
      if (cVar27 != '\0') {
        pcVar59 = secp256k1_modinv32;
      }
      pcStack_f0 = (code *)0x152782;
      (*pcVar59)(&local_e8,&local_b8);
      out[8] = 0;
      out[9] = 0;
      out[10] = 0;
      out[0xb] = 0;
      out[0xc] = 0;
      out[0xd] = 0;
      out[0xe] = 0;
      out[0xf] = 0;
      out[0] = 0;
      out[1] = 0;
      out[2] = 0;
      out[3] = 0;
      out[4] = 0;
      out[5] = 0;
      out[6] = 0;
      out[7] = 0;
      uVar12 = 0;
      do {
        out[uVar12 >> 4] =
             out[uVar12 >> 4] |
             (ushort)((*(uint *)((long)local_e8.modulus.v + (ulong)((uVar12 & 0xff) / 0x1e) * 4) >>
                       uVar12 % 0x1e & 1) != 0) << ((byte)uVar12 & 0xf);
        uVar12 = uVar12 + 1;
      } while (uVar12 != 0x100);
      psVar54 = &local_88;
      pcStack_f0 = (code *)0x1527e7;
      psVar32 = (secp256k1_modinv64_modinfo *)out;
      mulmod256((uint16_t *)psVar54,out,in,(uint16_t *)local_88.modulus_inv62);
      if ((ushort)local_88.modulus.v[0] != (uVar57 != 0)) break;
      lVar17 = 1;
      do {
        if (*(short *)((long)local_88.modulus.v + lVar17 * 2) != 0) {
          pcStack_f0 = (code *)0x1528a1;
          test_modinv32_uint16_cold_4();
          goto LAB_001528a1;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x10);
      pcStack_f0 = (code *)0x152817;
      (*pcVar59)(&local_e8,&local_b8);
      local_88.modulus.v[2] = 0;
      local_88.modulus.v[3] = 0;
      local_88.modulus.v[0] = 0;
      local_88.modulus.v[1] = 0;
      uVar12 = 0;
      do {
        uVar39 = *(uint *)((long)local_e8.modulus.v + (ulong)((uVar12 & 0xff) / 0x1e) * 4);
        psVar32 = (secp256k1_modinv64_modinfo *)(ulong)uVar39;
        uVar39 = (uint)((uVar39 >> uVar12 % 0x1e & 1) != 0) << ((byte)uVar12 & 0xf);
        psVar54 = (secp256k1_modinv64_modinfo *)(ulong)uVar39;
        puVar3 = (ushort *)((long)local_88.modulus.v + (ulong)(uVar12 >> 4) * 2);
        *puVar3 = *puVar3 | (ushort)uVar39;
        uVar12 = uVar12 + 1;
      } while (uVar12 != 0x100);
      lVar17 = 0;
      do {
        if (*(uint16_t *)((long)local_88.modulus.v + lVar17 * 2) != in[lVar17]) goto LAB_001528a1;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x10);
      mod = (uint16_t *)0x0;
      if (cVar27 == '\0') {
        return;
      }
    }
    goto LAB_001528a6;
  }
  pcStack_f0 = (code *)0x1524e6;
  mulmod256((uint16_t *)&local_88,in,in,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar12 = 0;
  do {
    puVar2 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar12 & 0xff) / 0x1e) * 4);
    *puVar2 = *puVar2 | (uint)((*(ushort *)((long)local_88.modulus.v + (ulong)(uVar12 >> 4) * 2) >>
                                (uVar12 & 0xf) & 1) != 0) <<
                        ((char)(uVar12 / 0x1e) * -0x1e + (char)uVar12 & 0x1fU);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0x100);
  psVar32 = &local_b8;
  pcStack_f0 = (code *)0x152552;
  uVar12 = secp256k1_jacobi32_maybe_var
                     ((secp256k1_modinv32_signed30 *)&local_e8,(secp256k1_modinv32_modinfo *)psVar32
                     );
  if (1 < uVar12) goto LAB_001528b0;
  local_58 = *mod - 1;
  local_56 = *(undefined8 *)(mod + 1);
  uStack_40 = *(undefined8 *)(mod + 0xc);
  uStack_4e = (undefined6)*(undefined8 *)(mod + 5);
  uStack_48 = (undefined2)*(undefined8 *)(mod + 8);
  uStack_46 = (undefined6)((ulong)*(undefined8 *)(mod + 8) >> 0x10);
  pcStack_f0 = (code *)0x15258b;
  mulmod256((uint16_t *)&local_88,(uint16_t *)&local_88,&local_58,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar12 = 0;
  do {
    puVar2 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar12 & 0xff) / 0x1e) * 4);
    *puVar2 = *puVar2 | (uint)((*(ushort *)((long)local_88.modulus.v + (ulong)(uVar12 >> 4) * 2) >>
                                (uVar12 & 0xf) & 1) != 0) <<
                        ((char)(uVar12 / 0x1e) * -0x1e + (char)uVar12 & 0x1fU);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0x100);
  psVar32 = &local_b8;
  pcStack_f0 = (code *)0x1525f7;
  iVar13 = secp256k1_jacobi32_maybe_var
                     ((secp256k1_modinv32_signed30 *)&local_e8,(secp256k1_modinv32_modinfo *)psVar32
                     );
  if ((iVar13 == 0) || (iVar13 == 1 - (*mod & 2))) goto LAB_00152610;
LAB_001528b5:
  pcStack_f0 = test_modinv64_uint16;
  test_modinv32_uint16_cold_2();
  pcStack_f0 = (code *)unaff_RBP;
  puStack_f8 = out;
  puStack_100 = in;
  pcStack_108 = pcVar59;
  uStack_110 = uVar47;
  puStack_118 = mod;
  psVar54 = &sStack_1d0;
  psVar61 = &sStack_1d0;
  sStack_1d0.modulus.v[0] = 0;
  sStack_1d0.modulus.v[1] = 0;
  sStack_1d0.modulus.v[2] = 0;
  sStack_1d0.modulus.v[3] = 0;
  sStack_1d0.modulus.v[4] = 0;
  uVar49 = 0;
  uVar47 = 0x8421084210842109;
  do {
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar49 >> 1;
    piVar1 = sStack_1d0.modulus.v + ((byte)((uVar49 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
    *piVar1 = *piVar1 | (ulong)((*(ushort *)
                                  ((long)(psVar32->modulus).v + (uVar49 >> 4 & 0xfffffff) * 2) >>
                                 ((uint)uVar49 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar73 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)uVar49 & 0x3fU);
    uVar49 = uVar49 + 1;
  } while ((int)uVar49 != 0x100);
  sStack_1d0.modulus_inv62 =
       sStack_1d0.modulus.v[1] | sStack_1d0.modulus.v[0] | sStack_1d0.modulus.v[2] |
       sStack_1d0.modulus.v[3] | sStack_1d0.modulus.v[4];
  sStack_1a0.modulus.v[0] = 0;
  sStack_1a0.modulus.v[1] = 0;
  sStack_1a0.modulus.v[2] = 0;
  sStack_1a0.modulus.v[3] = 0;
  sStack_1a0.modulus.v[4] = 0;
  psVar31 = (secp256k1_modinv64_modinfo *)0x0;
  do {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (ulong)psVar31 >> 1;
    piVar1 = sStack_1a0.modulus.v + ((byte)(((ulong)psVar31 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
    *piVar1 = *piVar1 | (ulong)((*(ushort *)
                                  ((long)(m_00->modulus).v + ((ulong)psVar31 >> 4 & 0xfffffff) * 2)
                                 >> ((uint)psVar31 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar6 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)psVar31 & 0x3fU);
    iVar60 = sStack_1a0.modulus.v[0];
    psVar31 = (secp256k1_modinv64_modinfo *)((long)(psVar31->modulus).v + 1);
  } while ((int)psVar31 != 0x100);
  pcVar59 = (code *)0x3fffffffffffffff;
  pcStack_1d8 = (code *)0x1529e5;
  psVar41 = (secp256k1_modinv64_modinfo *)sStack_1a0.modulus.v[0];
  uVar16 = modinv2p64(sStack_1a0.modulus.v[0]);
  sStack_1a0.modulus_inv62 = uVar16 & 0x3fffffffffffffff;
  psVar55 = (secp256k1_modinv64_modinfo *)(iVar60 * uVar16 & 0x3fffffffffffffff);
  psVar23 = m_00;
  if (psVar55 == (secp256k1_modinv64_modinfo *)0x1) {
    if (sStack_1d0.modulus_inv62 == 0) {
LAB_00152b5d:
      sStack_1d0.modulus.v[2] = 0;
      sStack_1d0.modulus.v[3] = 0;
      sStack_1d0.modulus.v[0] = 0;
      sStack_1d0.modulus.v[1] = 0;
      sStack_1d0.modulus.v[4] = 0;
      uVar49 = 0;
      do {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar49 >> 1;
        piVar1 = sStack_1d0.modulus.v + ((byte)((uVar49 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
        *piVar1 = *piVar1 | (ulong)((*(ushort *)
                                      ((long)(psVar32->modulus).v + (uVar49 >> 4 & 0xfffffff) * 2)
                                     >> ((uint)uVar49 & 0xf) & 1) != 0) <<
                            ((char)(SUB164(auVar9 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                             (char)uVar49 & 0x3fU);
        uVar49 = uVar49 + 1;
      } while ((int)uVar49 != 0x100);
      sStack_170.modulus_inv62 = (uint64_t)m_00;
      iVar13 = 8;
      do {
        uVar49 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                 secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) +
                 secp256k1_test_state[0];
        uVar48 = uVar49 >> 0x1e;
        uVar49 = uVar49 >> 0x3e;
        lVar17 = sStack_1a0.modulus.v[uVar49];
        if (lVar17 < 1) {
          if (lVar17 < 0) {
            uVar48 = uVar48 + 0x100000000 >> 0x20;
            lVar22 = sStack_1a0.modulus.v[uVar48];
            if (-0x4000000000000000 < lVar22) {
              lVar17 = lVar17 + 0x4000000000000000;
              sStack_1a0.modulus.v[uVar49] = lVar17;
              iVar60 = lVar22 + -1;
              goto LAB_00152c51;
            }
          }
        }
        else {
          uVar48 = uVar48 + 0x100000000 >> 0x20;
          lVar22 = sStack_1a0.modulus.v[uVar48];
          if (lVar22 < 0x4000000000000000) {
            lVar17 = lVar17 + -0x4000000000000000;
            sStack_1a0.modulus.v[uVar49] = lVar17;
            iVar60 = lVar22 + 1;
LAB_00152c51:
            sStack_1a0.modulus.v[uVar48] = iVar60;
          }
        }
        uVar50 = secp256k1_test_state[1] << 0x11;
        uVar48 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
        uVar49 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
        secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar48;
        secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar49;
        secp256k1_test_state[2] = uVar48 ^ uVar50;
        secp256k1_test_state[3] = uVar49 << 0x2d | uVar49 >> 0x13;
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
      bVar68 = sStack_1d0.modulus_inv62 != 0;
      psVar23 = (secp256k1_modinv64_modinfo *)(ulong)bVar68;
      psVar55 = (secp256k1_modinv64_modinfo *)CONCAT71((int7)((ulong)lVar17 >> 8),1);
      while( true ) {
        cVar27 = (char)psVar55;
        pcVar59 = secp256k1_modinv64_var;
        if (cVar27 != '\0') {
          pcVar59 = secp256k1_modinv64;
        }
        pcStack_1d8 = (code *)0x152d03;
        (*pcVar59)(&sStack_1d0);
        (psVar42->modulus).v[2] = 0;
        (psVar42->modulus).v[3] = 0;
        (psVar42->modulus).v[0] = 0;
        (psVar42->modulus).v[1] = 0;
        uVar49 = 0;
        do {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = uVar49 >> 1;
          puVar3 = (ushort *)((long)(psVar42->modulus).v + (uVar49 >> 4 & 0xfffffff) * 2);
          *puVar3 = *puVar3 | (ushort)(((ulong)sStack_1d0.modulus.v
                                               [((byte)((uVar49 & 0xffffffff) >> 1) & 0x7f) / 0x1f]
                                        >> ((ulong)((SUB164(auVar10 * ZEXT816(0x8421084210842109),8)
                                                    >> 4) * 2 + (int)uVar49) & 0x3f) & 1) != 0) <<
                              ((byte)uVar49 & 0xf);
          uVar49 = uVar49 + 1;
        } while ((int)uVar49 != 0x100);
        psVar41 = &sStack_170;
        pcStack_1d8 = (code *)0x152d74;
        psVar31 = psVar42;
        mulmod256((uint16_t *)psVar41,(uint16_t *)psVar42,(uint16_t *)psVar32,
                  (uint16_t *)sStack_170.modulus_inv62);
        if ((ushort)sStack_170.modulus.v[0] != bVar68) break;
        lVar17 = 1;
        do {
          if (*(short *)((long)sStack_170.modulus.v + lVar17 * 2) != 0) {
            pcStack_1d8 = (code *)0x152e3c;
            test_modinv64_uint16_cold_4();
            goto LAB_00152e3c;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x10);
        pcStack_1d8 = (code *)0x152da4;
        (*pcVar59)(&sStack_1d0);
        sStack_170.modulus.v[2] = 0;
        sStack_170.modulus.v[3] = 0;
        sStack_170.modulus.v[0] = 0;
        sStack_170.modulus.v[1] = 0;
        psVar31 = (secp256k1_modinv64_modinfo *)0x0;
        do {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = (ulong)psVar31 >> 1;
          psVar41 = (secp256k1_modinv64_modinfo *)
                    ((ulong)(((ulong)sStack_1d0.modulus.v
                                     [((byte)(((ulong)psVar31 & 0xffffffff) >> 1) & 0x7f) / 0x1f] >>
                              ((ulong)((SUB164(auVar11 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                                      (int)psVar31) & 0x3f) & 1) != 0) << ((byte)psVar31 & 0xf));
          puVar3 = (ushort *)((long)sStack_170.modulus.v + ((ulong)psVar31 >> 4 & 0xfffffff) * 2);
          *puVar3 = *puVar3 | (ushort)psVar41;
          psVar31 = (secp256k1_modinv64_modinfo *)((long)(psVar31->modulus).v + 1);
        } while ((int)psVar31 != 0x100);
        lVar17 = 0;
        do {
          if (*(short *)((long)sStack_170.modulus.v + lVar17 * 2) !=
              *(short *)((long)(psVar32->modulus).v + lVar17 * 2)) goto LAB_00152e3c;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x10);
        psVar55 = (secp256k1_modinv64_modinfo *)0x0;
        if (cVar27 == '\0') {
          return;
        }
      }
LAB_00152e41:
      pcStack_1d8 = (code *)0x152e46;
      test_modinv64_uint16_cold_3();
      goto LAB_00152e46;
    }
    pcStack_1d8 = (code *)0x152a1f;
    mulmod256((uint16_t *)&sStack_170,(uint16_t *)psVar32,(uint16_t *)psVar32,(uint16_t *)m_00);
    sStack_1d0.modulus.v[2] = 0;
    sStack_1d0.modulus.v[3] = 0;
    sStack_1d0.modulus.v[0] = 0;
    sStack_1d0.modulus.v[1] = 0;
    sStack_1d0.modulus.v[4] = 0;
    uVar49 = 0;
    do {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar49 >> 1;
      piVar1 = sStack_1d0.modulus.v + ((byte)((uVar49 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
      *piVar1 = *piVar1 | (ulong)((*(ushort *)
                                    ((long)sStack_170.modulus.v + (uVar49 >> 4 & 0xfffffff) * 2) >>
                                   ((uint)uVar49 & 0xf) & 1) != 0) <<
                          ((char)(SUB164(auVar7 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                           (char)uVar49 & 0x3fU);
      uVar49 = uVar49 + 1;
    } while ((int)uVar49 != 0x100);
    psVar31 = &sStack_1a0;
    pcStack_1d8 = (code *)0x152a95;
    uVar12 = secp256k1_jacobi64_maybe_var(&sStack_1d0.modulus,psVar31);
    if (1 < uVar12) goto LAB_00152e4b;
    uStack_140 = (short)(m_00->modulus).v[0] - 1;
    uStack_13e = *(undefined8 *)((long)(m_00->modulus).v + 2);
    iVar60 = (m_00->modulus).v[2];
    iStack_128 = (m_00->modulus).v[3];
    uStack_136 = (undefined6)*(undefined8 *)((long)(m_00->modulus).v + 10);
    uStack_130 = (undefined2)iVar60;
    uStack_12e = (undefined6)((ulong)iVar60 >> 0x10);
    pcStack_1d8 = (code *)0x152ace;
    mulmod256((uint16_t *)&sStack_170,(uint16_t *)&sStack_170,&uStack_140,(uint16_t *)m_00);
    sStack_1d0.modulus.v[2] = 0;
    sStack_1d0.modulus.v[3] = 0;
    sStack_1d0.modulus.v[0] = 0;
    sStack_1d0.modulus.v[1] = 0;
    sStack_1d0.modulus.v[4] = 0;
    uVar49 = 0;
    do {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar49 >> 1;
      piVar1 = sStack_1d0.modulus.v + ((byte)((uVar49 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
      *piVar1 = *piVar1 | (ulong)((*(ushort *)
                                    ((long)sStack_170.modulus.v + (uVar49 >> 4 & 0xfffffff) * 2) >>
                                   ((uint)uVar49 & 0xf) & 1) != 0) <<
                          ((char)(SUB164(auVar8 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                           (char)uVar49 & 0x3fU);
      uVar49 = uVar49 + 1;
    } while ((int)uVar49 != 0x100);
    psVar31 = &sStack_1a0;
    pcStack_1d8 = (code *)0x152b44;
    iVar13 = secp256k1_jacobi64_maybe_var(&sStack_1d0.modulus,psVar31);
    if ((iVar13 == 0) || (iVar13 == 1 - ((ushort)(m_00->modulus).v[0] & 2))) goto LAB_00152b5d;
  }
  else {
LAB_00152e46:
    pcStack_1d8 = (code *)0x152e4b;
    test_modinv64_uint16_cold_1();
    psVar54 = psVar41;
LAB_00152e4b:
    psVar61 = psVar54;
    pcStack_1d8 = (code *)0x152e50;
    test_modinv64_uint16_cold_6();
  }
  pcStack_1d8 = modinv2p64;
  test_modinv64_uint16_cold_2();
  if (((ulong)psVar61 & 1) != 0) {
    iVar13 = 6;
    do {
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
    return;
  }
  pcStack_1e0 = secp256k1_jacobi32_maybe_var;
  modinv2p64_cold_1();
  pcStack_1e0 = (code *)0x8421084210842109;
  psStack_1e8 = psVar42;
  psStack_1f0 = psVar32;
  psStack_1f8 = (secp256k1_modinv64_modinfo *)pcVar59;
  psStack_200 = psVar55;
  psStack_208 = psVar23;
  sStack_240.modulus.v[4]._0_4_ = (int32_t)(psVar31->modulus).v[4];
  sStack_240.modulus.v[0] = (psVar31->modulus).v[0];
  sStack_240.modulus.v[2] = (psVar31->modulus).v[2];
  sStack_240.modulus.v[3] = (psVar31->modulus).v[3];
  sStack_240.modulus.v[1] = (psVar31->modulus).v[1];
  iVar60 = (psVar61->modulus).v[0];
  sStack_270.modulus.v[1] = (psVar61->modulus).v[1];
  piVar1 = (psVar61->modulus).v + 2;
  sStack_270.modulus.v[2] = *piVar1;
  sStack_270.modulus.v[3] = (psVar61->modulus).v[3];
  sStack_270.modulus.v[0]._0_4_ = (uint)iVar60;
  sStack_270.modulus.v[0]._4_4_ = (uint)((ulong)iVar60 >> 0x20);
  sStack_270.modulus.v[4]._0_4_ = (int)(psVar61->modulus).v[4];
  auVar73 = packssdw(*(undefined1 (*) [16])(psVar61->modulus).v,*(undefined1 (*) [16])piVar1);
  if (((((((((auVar73 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar73 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar73 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar73 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar73 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar73 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar73 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar73[0xf]) &&
     (-1 < (int)sStack_270.modulus.v[4])) {
    uVar12 = (uint)((ulong)sStack_270.modulus.v[1] >> 0x20) | (uint)sStack_270.modulus.v[1] |
             sStack_270.modulus.v[0]._4_4_ | (uint)sStack_270.modulus.v[0];
    psVar32 = (secp256k1_modinv64_modinfo *)(ulong)uVar12;
    psVar54 = psVar55;
    psVar41 = psVar31;
    if (((int)((ulong)sStack_270.modulus.v[3] >> 0x20) != 0 ||
        (((int)sStack_270.modulus.v[3] != 0 ||
         ((int)((ulong)sStack_270.modulus.v[2] >> 0x20) != 0 || (int)sStack_270.modulus.v[2] != 0))
        || uVar12 != 0)) || (int)sStack_270.modulus.v[4] != 0) {
      psStack_290 = (secp256k1_modinv64_modinfo *)0x9;
      uVar47 = 0xffffffff;
      iStack_288 = 0;
      psVar23 = (secp256k1_modinv64_modinfo *)(sStack_240.modulus.v[0] & 0xffffffff);
      psVar42 = (secp256k1_modinv64_modinfo *)0x0;
      psStack_210 = psVar31;
      do {
        psVar41 = psStack_210;
        psVar54 = psStack_290;
        uStack_284 = sStack_270.modulus.v[0]._4_4_ << 0x1e | (uint)sStack_270.modulus.v[0];
        uVar53 = sStack_240.modulus.v[0]._4_4_ << 0x1e | (uint)psVar23;
        psVar55 = (secp256k1_modinv64_modinfo *)(ulong)uVar53;
        uVar12 = 1;
        psVar51 = (secp256k1_modinv64_modinfo *)0x0;
        uVar14 = 0x1e;
        psVar61 = (secp256k1_modinv64_modinfo *)0x0;
        uVar57 = 1;
        psVar23 = psVar55;
        uVar39 = uStack_284;
        while( true ) {
          psVar32 = psVar42;
          psVar31 = (secp256k1_modinv64_modinfo *)(ulong)uStack_284;
          pcVar59 = (code *)&sStack_270;
          uVar58 = (uint)psVar23;
          uVar28 = -1 << ((byte)uVar14 & 0x1f) | uVar39;
          uVar19 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
            }
          }
          bVar18 = (byte)uVar19;
          uVar39 = uVar39 >> (bVar18 & 0x1f);
          uVar57 = uVar57 << (bVar18 & 0x1f);
          uVar40 = (int)psVar61 << (bVar18 & 0x1f);
          psVar61 = (secp256k1_modinv64_modinfo *)(ulong)uVar40;
          uVar28 = (int)uVar47 - uVar19;
          uVar47 = (ulong)uVar28;
          psVar30 = (secp256k1_modinv64_modinfo *)((ulong)psVar23 >> 1);
          uVar65 = ((uint)((ulong)psVar23 >> 2) ^ (uint)psVar30) & uVar19 ^ (uint)psVar32;
          psVar42 = (secp256k1_modinv64_modinfo *)(ulong)uVar65;
          uVar14 = uVar14 - uVar19;
          uVar19 = (uint)psVar51;
          if (uVar14 == 0) break;
          if (((ulong)psVar23 & 1) == 0) {
            pcStack_298 = (code *)0x15329b;
            secp256k1_jacobi32_maybe_var_cold_6();
LAB_0015329b:
            pcStack_298 = (code *)0x1532a0;
            secp256k1_jacobi32_maybe_var_cold_5();
LAB_001532a0:
            pcStack_298 = (code *)0x1532a5;
            secp256k1_jacobi32_maybe_var_cold_1();
LAB_001532a5:
            psVar23 = psVar30;
            pcStack_298 = (code *)0x1532aa;
            secp256k1_jacobi32_maybe_var_cold_2();
            psVar51 = psVar55;
LAB_001532aa:
            psVar55 = psVar51;
            pcStack_298 = (code *)0x1532af;
            secp256k1_jacobi32_maybe_var_cold_4();
            goto LAB_001532af;
          }
          if ((uVar39 & 1) == 0) goto LAB_0015329b;
          uVar29 = uVar40 * uStack_284 + uVar57 * uVar53;
          psVar30 = (secp256k1_modinv64_modinfo *)(ulong)uVar29;
          bVar18 = 0x1e - (char)uVar14;
          uVar63 = uVar58 << (bVar18 & 0x1f);
          psVar32 = (secp256k1_modinv64_modinfo *)(ulong)uVar63;
          if (uVar29 != uVar63) goto LAB_001532a0;
          uVar63 = uVar12 * uStack_284 + uVar19 * uVar53;
          psVar32 = (secp256k1_modinv64_modinfo *)(ulong)uVar63;
          uVar29 = uVar39 << (bVar18 & 0x1f);
          psVar30 = (secp256k1_modinv64_modinfo *)(ulong)uVar29;
          if (uVar63 != uVar29) goto LAB_001532a5;
          psVar32 = psVar51;
          if ((int)uVar28 < 0) {
            uVar47 = (ulong)-uVar28;
            psVar42 = (secp256k1_modinv64_modinfo *)(ulong)(uVar65 ^ (uVar39 & uVar58) >> 1);
            psVar23 = (secp256k1_modinv64_modinfo *)(ulong)uVar39;
            psVar61 = (secp256k1_modinv64_modinfo *)(ulong)uVar12;
            psVar32 = (secp256k1_modinv64_modinfo *)(ulong)uVar57;
            uVar57 = uVar19;
            uVar39 = uVar58;
            uVar12 = uVar40;
          }
          uVar19 = (int)uVar47 + 1;
          if ((int)uVar14 <= (int)uVar19) {
            uVar19 = uVar14;
          }
          psVar31 = psVar55;
          psVar51 = (secp256k1_modinv64_modinfo *)(ulong)uVar12;
          if (0x1e < uVar19) goto LAB_001532aa;
          uVar58 = (uint)(0xff << (-(char)uVar19 & 0x1fU)) >> (-(char)uVar19 & 0x1fU);
          uVar19 = secp256k1_modinv32_inv256[(uint)((ulong)psVar23 >> 1) & 0x7f] * uVar39 & uVar58;
          uVar39 = uVar19 * (int)psVar23 + uVar39;
          psVar51 = (secp256k1_modinv64_modinfo *)(ulong)(uVar19 * uVar57 + (int)psVar32);
          uVar12 = uVar19 * (int)psVar61 + uVar12;
          psVar31 = (secp256k1_modinv64_modinfo *)(ulong)uStack_284;
          if ((uVar39 & uVar58) != 0) {
LAB_001532af:
            pcVar59 = (code *)&sStack_270;
            pcStack_298 = (code *)0x1532b4;
            secp256k1_jacobi32_maybe_var_cold_3();
            goto LAB_001532b4;
          }
        }
        lVar17 = (long)(int)uVar12 * (long)(int)uVar57 - (long)(int)uVar19 * (long)(int)uVar40;
        psVar23 = &sStack_240;
        sStack_280.u = uVar57;
        sStack_280.v = uVar40;
        sStack_280.q = uVar19;
        sStack_280.r = uVar12;
        if ((lVar17 != -0x40000000) && (lVar17 != 0x40000000)) goto LAB_001532e6;
        iVar20 = (int)psStack_290;
        psVar31 = (secp256k1_modinv64_modinfo *)((ulong)psStack_290 & 0xffffffff);
        pcStack_298 = (code *)0x153138;
        psVar61 = psVar23;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar23,iVar20,
                            (secp256k1_modinv32_signed30 *)psStack_210,0);
        if (iVar13 < 1) goto LAB_001532b9;
        psVar31 = (secp256k1_modinv64_modinfo *)((ulong)psVar54 & 0xffffffff);
        pcStack_298 = (code *)0x153153;
        psVar61 = psVar23;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar23,iVar20,
                            (secp256k1_modinv32_signed30 *)psVar41,1);
        if (0 < iVar13) goto LAB_001532be;
        psVar31 = (secp256k1_modinv64_modinfo *)((ulong)psVar54 & 0xffffffff);
        pcStack_298 = (code *)0x15316b;
        psVar61 = (secp256k1_modinv64_modinfo *)pcVar59;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar59,iVar20,
                            (secp256k1_modinv32_signed30 *)psVar41,0);
        if (iVar13 < 1) goto LAB_001532c3;
        psVar31 = (secp256k1_modinv64_modinfo *)((ulong)psVar54 & 0xffffffff);
        pcStack_298 = (code *)0x153186;
        psVar61 = (secp256k1_modinv64_modinfo *)pcVar59;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar59,iVar20,
                            (secp256k1_modinv32_signed30 *)psVar41,1);
        if (-1 < iVar13) goto LAB_001532c8;
        pcStack_298 = (code *)0x1531a1;
        secp256k1_modinv32_update_fg_30_var
                  (iVar20,(secp256k1_modinv32_signed30 *)psVar23,
                   (secp256k1_modinv32_signed30 *)pcVar59,&sStack_280);
        psVar23 = (secp256k1_modinv64_modinfo *)(sStack_240.modulus.v[0] & 0xffffffff);
        if ((int)sStack_240.modulus.v[0] == 1) {
          if (iVar20 < 2) {
            return;
          }
          uVar12 = 0;
          uVar49 = 1;
          do {
            uVar12 = uVar12 | *(uint *)((long)sStack_240.modulus.v + uVar49 * 4);
            uVar49 = uVar49 + 1;
          } while (((ulong)psVar54 & 0xffffffff) != uVar49);
          psVar54 = psStack_290;
          if (uVar12 == 0) {
            return;
          }
        }
        iVar13 = (int)psVar54;
        psVar54 = (secp256k1_modinv64_modinfo *)((ulong)psVar54 & 0xffffffff);
        if ((-1 < iVar13 + -2 && *(int *)((long)sStack_240.modulus.v + (long)iVar13 * 4 + -4) == 0)
            && *(int *)((long)sStack_270.modulus.v + (long)iVar13 * 4 + -4) == 0) {
          psVar54 = (secp256k1_modinv64_modinfo *)(ulong)(iVar13 - 1);
        }
        pcVar59 = (code *)&sStack_240;
        pcStack_298 = (code *)0x153207;
        iVar20 = (int)psVar54;
        psVar31 = psVar54;
        psVar61 = (secp256k1_modinv64_modinfo *)pcVar59;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar59,iVar20,
                            (secp256k1_modinv32_signed30 *)psVar41,0);
        if (iVar13 < 1) goto LAB_001532cd;
        pcStack_298 = (code *)0x153222;
        psVar31 = psVar54;
        psVar61 = (secp256k1_modinv64_modinfo *)pcVar59;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar59,iVar20,
                            (secp256k1_modinv32_signed30 *)psVar41,1);
        if (0 < iVar13) goto LAB_001532d2;
        pcVar59 = (code *)&sStack_270;
        pcStack_298 = (code *)0x15323f;
        psVar31 = psVar54;
        psVar61 = (secp256k1_modinv64_modinfo *)pcVar59;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar59,iVar20,
                            (secp256k1_modinv32_signed30 *)psVar41,0);
        if (iVar13 < 1) goto LAB_001532d7;
        pcStack_298 = (code *)0x15325e;
        psVar31 = psVar54;
        psVar61 = (secp256k1_modinv64_modinfo *)pcVar59;
        psStack_290 = psVar54;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar59,iVar20,
                            (secp256k1_modinv32_signed30 *)psVar41,1);
        if (-1 < iVar13) goto LAB_001532dc;
        iStack_288 = iStack_288 + 1;
        if (iStack_288 == 0x19) {
          return;
        }
      } while( true );
    }
  }
  else {
LAB_001532b4:
    pcStack_298 = (code *)0x1532b9;
    secp256k1_jacobi32_maybe_var_cold_17();
    psVar54 = psVar55;
    psVar41 = psVar32;
LAB_001532b9:
    pcStack_298 = (code *)0x1532be;
    secp256k1_jacobi32_maybe_var_cold_14();
LAB_001532be:
    pcStack_298 = (code *)0x1532c3;
    secp256k1_jacobi32_maybe_var_cold_13();
LAB_001532c3:
    pcStack_298 = (code *)0x1532c8;
    secp256k1_jacobi32_maybe_var_cold_12();
LAB_001532c8:
    pcStack_298 = (code *)0x1532cd;
    secp256k1_jacobi32_maybe_var_cold_11();
LAB_001532cd:
    pcStack_298 = (code *)0x1532d2;
    secp256k1_jacobi32_maybe_var_cold_10();
LAB_001532d2:
    pcStack_298 = (code *)0x1532d7;
    secp256k1_jacobi32_maybe_var_cold_9();
LAB_001532d7:
    pcStack_298 = (code *)0x1532dc;
    secp256k1_jacobi32_maybe_var_cold_8();
LAB_001532dc:
    pcStack_298 = (code *)0x1532e1;
    secp256k1_jacobi32_maybe_var_cold_7();
    psVar32 = psVar31;
  }
  psVar31 = psVar32;
  pcStack_298 = (code *)0x1532e6;
  secp256k1_jacobi32_maybe_var_cold_16();
LAB_001532e6:
  pcStack_298 = secp256k1_modinv32_var;
  secp256k1_jacobi32_maybe_var_cold_15();
  pcStack_298 = (code *)uVar47;
  psStack_2a0 = psVar42;
  psStack_2a8 = psVar41;
  psStack_2b0 = (secp256k1_modinv64_modinfo *)pcVar59;
  psStack_2b8 = psVar54;
  psStack_2c0 = psVar23;
  auStack_308._16_8_ = 0;
  auStack_308._24_8_ = 0;
  auStack_308._0_8_ = 0;
  auStack_308._8_8_ = 0;
  auStack_308._32_4_ = 0;
  uStack_2d0 = 0;
  uStack_2c8 = 0;
  uStack_2e0 = 0;
  uStack_2d8 = 0;
  auStack_308._36_4_ = 1;
  sStack_378.modulus.v[4]._0_4_ = (int32_t)(psVar31->modulus).v[4];
  uStack_340 = psVar31;
  sStack_378.modulus.v[2] = (psVar31->modulus).v[2];
  sStack_378.modulus.v[3] = (psVar31->modulus).v[3];
  sStack_378.modulus.v[0] = (psVar31->modulus).v[0];
  sStack_378.modulus.v[1] = (psVar31->modulus).v[1];
  sStack_338.modulus.v[4]._0_4_ = (int32_t)(psVar61->modulus).v[4];
  sStack_338.modulus.v[0] = (psVar61->modulus).v[0];
  sStack_338.modulus.v[1] = (psVar61->modulus).v[1];
  psStack_348 = psVar61;
  sStack_338.modulus.v[2] = (psVar61->modulus).v[2];
  sStack_338.modulus.v[3] = (psVar61->modulus).v[3];
  iStack_394 = 0;
  uVar47 = 0xffffffff;
  psStack_390 = (secp256k1_modinv64_modinfo *)0x9;
LAB_00153380:
  psVar32 = uStack_340;
  psVar54 = psStack_390;
  psVar41 = (secp256k1_modinv64_modinfo *)(sStack_378.modulus.v[0] & 0xffffffff);
  psVar61 = (secp256k1_modinv64_modinfo *)(sStack_338.modulus.v[0] & 0xffffffff);
  uVar12 = 1;
  psVar23 = (secp256k1_modinv64_modinfo *)0x0;
  iVar13 = 0x1e;
  uVar14 = 0;
  psVar31 = (secp256k1_modinv64_modinfo *)0x1;
  uVar57 = (uint)sStack_378.modulus.v[0];
  uVar39 = (uint)sStack_338.modulus.v[0];
  while( true ) {
    uVar53 = -1 << ((byte)iVar13 & 0x1f) | uVar39;
    iVar20 = 0;
    if (uVar53 != 0) {
      for (; (uVar53 >> iVar20 & 1) == 0; iVar20 = iVar20 + 1) {
      }
    }
    bVar18 = (byte)iVar20;
    uVar39 = uVar39 >> (bVar18 & 0x1f);
    uVar19 = (int)psVar31 << (bVar18 & 0x1f);
    psVar31 = (secp256k1_modinv64_modinfo *)(ulong)uVar19;
    uVar14 = uVar14 << (bVar18 & 0x1f);
    uVar58 = (int)uVar47 - iVar20;
    uVar47 = (ulong)uVar58;
    iVar13 = iVar13 - iVar20;
    iVar20 = (int)psVar23;
    if (iVar13 == 0) break;
    if ((uVar57 & 1) == 0) {
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1537a7;
      secp256k1_modinv32_var_cold_7();
LAB_001537a7:
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1537ac;
      secp256k1_modinv32_var_cold_6();
LAB_001537ac:
      psVar55 = (secp256k1_modinv64_modinfo *)(ulong)uVar53;
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1537b1;
      secp256k1_modinv32_var_cold_1();
LAB_001537b1:
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1537b6;
      secp256k1_modinv32_var_cold_2();
LAB_001537b6:
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1537bb;
      secp256k1_modinv32_var_cold_5();
LAB_001537bb:
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1537c0;
      secp256k1_modinv32_var_cold_4();
      goto LAB_001537c0;
    }
    if ((uVar39 & 1) == 0) goto LAB_001537a7;
    uVar53 = uVar14 * (uint)sStack_338.modulus.v[0] + uVar19 * (uint)sStack_378.modulus.v[0];
    bVar18 = 0x1e - (char)iVar13;
    uVar28 = uVar57 << (bVar18 & 0x1f);
    pcVar59 = (code *)(ulong)uVar28;
    if (uVar53 != uVar28) goto LAB_001537ac;
    uVar53 = uVar12 * (uint)sStack_338.modulus.v[0] + iVar20 * (uint)sStack_378.modulus.v[0];
    pcVar59 = (code *)(ulong)uVar53;
    uVar28 = uVar39 << (bVar18 & 0x1f);
    psVar55 = (secp256k1_modinv64_modinfo *)(ulong)uVar28;
    if (uVar53 != uVar28) goto LAB_001537b1;
    if (uVar58 - 0x2f0 < 0xfffffa21) goto LAB_001537b6;
    psVar55 = psVar23;
    if ((int)uVar58 < 0) {
      uVar47 = (ulong)-uVar58;
      uVar53 = -uVar57;
      uVar58 = -uVar14;
      psVar31 = psVar23;
      psVar55 = (secp256k1_modinv64_modinfo *)(ulong)-uVar19;
      uVar57 = uVar39;
      uVar39 = uVar53;
      uVar14 = uVar12;
      uVar12 = uVar58;
    }
    pcVar59 = (code *)(ulong)uVar12;
    iVar20 = (int)uVar47 + 1;
    if (iVar13 <= iVar20) {
      iVar20 = iVar13;
    }
    if (iVar20 - 0x1fU < 0xffffffe2) goto LAB_001537bb;
    uVar19 = (uint)(0xff << (-(char)iVar20 & 0x1fU)) >> (-(char)iVar20 & 0x1fU);
    psVar42 = (secp256k1_modinv64_modinfo *)(ulong)uVar19;
    uVar53 = secp256k1_modinv32_inv256[uVar57 >> 1 & 0x7f] * uVar39 & uVar19;
    uVar39 = uVar39 + uVar53 * uVar57;
    psVar23 = (secp256k1_modinv64_modinfo *)(ulong)(uVar53 * (int)psVar31 + (int)psVar55);
    uVar12 = uVar53 * uVar14 + uVar12;
    if ((uVar39 & uVar19) != 0) {
LAB_001537c0:
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1537c5;
      secp256k1_modinv32_var_cold_3();
      psVar54 = psVar55;
      goto LAB_001537c5;
    }
  }
  sStack_388.u = uVar19;
  sStack_388.v = uVar14;
  sStack_388.q = iVar20;
  sStack_388.r = uVar12;
  if ((long)(int)uVar12 * (long)(int)uVar19 - (long)iVar20 * (long)(int)uVar14 == 0x40000000) {
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x153526;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)auStack_308,
               (secp256k1_modinv32_signed30 *)(auStack_308 + 0x24),&sStack_388,
               (secp256k1_modinv32_modinfo *)uStack_340);
    psVar42 = &sStack_378;
    iVar20 = (int)psVar54;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x15353e;
    psVar41 = psVar54;
    psVar61 = psVar42;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar42,iVar20,
                        (secp256k1_modinv32_signed30 *)psVar32,-1);
    if (iVar13 < 1) goto LAB_001537ca;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x153559;
    psVar41 = psVar54;
    psVar61 = psVar42;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar42,iVar20,
                        (secp256k1_modinv32_signed30 *)psVar32,1);
    if (0 < iVar13) goto LAB_001537cf;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x153574;
    psVar41 = psVar54;
    psVar61 = &sStack_338;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_338,iVar20,
                        (secp256k1_modinv32_signed30 *)psVar32,-1);
    if (iVar13 < 1) goto LAB_001537d4;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x15358f;
    psVar41 = psVar54;
    psVar61 = &sStack_338;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_338,iVar20,
                        (secp256k1_modinv32_signed30 *)psVar32,1);
    if (-1 < iVar13) goto LAB_001537d9;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1535ac;
    secp256k1_modinv32_update_fg_30_var
              (iVar20,(secp256k1_modinv32_signed30 *)&sStack_378,
               (secp256k1_modinv32_signed30 *)&sStack_338,&sStack_388);
    if ((uint)sStack_338.modulus.v[0] == 0) {
      if (1 < iVar20) {
        uVar12 = 0;
        psVar61 = (secp256k1_modinv64_modinfo *)0x1;
        do {
          uVar12 = uVar12 | *(uint *)((long)sStack_338.modulus.v + (long)psVar61 * 4);
          psVar61 = (secp256k1_modinv64_modinfo *)((long)(psVar61->modulus).v + 1);
        } while (psVar54 != psVar61);
        if (uVar12 != 0) goto LAB_001535db;
      }
      psVar61 = &sStack_338;
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1536b7;
      psVar41 = psVar54;
      iVar13 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar61,iVar20,&SECP256K1_SIGNED30_ONE,0);
      psVar31 = psVar54;
      if (iVar13 != 0) goto LAB_001537f7;
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1536d8;
      iVar13 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)&sStack_378,iVar20,&SECP256K1_SIGNED30_ONE,
                          -1);
      psVar31 = psStack_348;
      if (iVar13 != 0) {
        psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1536fd;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)&sStack_378,iVar20,
                            &SECP256K1_SIGNED30_ONE,1);
        if (iVar13 != 0) {
          psVar41 = (secp256k1_modinv64_modinfo *)0x9;
          psStack_3a0 = (secp256k1_modinv64_modinfo *)0x153717;
          psVar61 = psVar31;
          iVar13 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar31,9,&SECP256K1_SIGNED30_ONE,0);
          if (iVar13 != 0) goto LAB_001537fc;
          psVar61 = (secp256k1_modinv64_modinfo *)auStack_308;
          psVar41 = (secp256k1_modinv64_modinfo *)0x9;
          psStack_3a0 = (secp256k1_modinv64_modinfo *)0x15373a;
          iVar13 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar61,9,&SECP256K1_SIGNED30_ONE,0);
          if (iVar13 != 0) goto LAB_001537fc;
          psVar61 = &sStack_378;
          psStack_3a0 = (secp256k1_modinv64_modinfo *)0x153757;
          psVar41 = psVar54;
          iVar13 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar61,iVar20,
                              (secp256k1_modinv32_signed30 *)psVar32,1);
          if (iVar13 != 0) goto LAB_001537fc;
        }
      }
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x153779;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)auStack_308,
                 *(int32_t *)((long)sStack_378.modulus.v + (long)iVar20 * 4 + -4),
                 (secp256k1_modinv32_modinfo *)psVar32);
      *(undefined4 *)((psVar31->modulus).v + 4) = auStack_308._32_4_;
      (psVar31->modulus).v[2] = auStack_308._16_8_;
      (psVar31->modulus).v[3] = auStack_308._24_8_;
      (psVar31->modulus).v[0] = auStack_308._0_8_;
      (psVar31->modulus).v[1] = auStack_308._8_8_;
      return;
    }
LAB_001535db:
    uVar12 = *(uint *)((long)sStack_378.modulus.v + (long)iVar20 * 4 + -4);
    uVar57 = *(uint *)((long)&uStack_340 + (long)iVar20 * 4 + 4);
    iVar13 = iVar20 + -2;
    uVar39 = (int)uVar12 >> 0x1f ^ uVar12 | iVar13 >> 0x1f;
    psVar61 = (secp256k1_modinv64_modinfo *)(ulong)uVar39;
    uVar39 = (int)uVar57 >> 0x1f ^ uVar57 | uVar39;
    psVar41 = (secp256k1_modinv64_modinfo *)(ulong)uVar39;
    if (uVar39 == 0) {
      psVar54 = (secp256k1_modinv64_modinfo *)(ulong)(iVar20 - 1);
      puVar2 = (uint *)((long)sStack_378.modulus.v + (long)iVar13 * 4);
      *puVar2 = *puVar2 | uVar12 << 0x1e;
      puVar2 = (uint *)((long)sStack_338.modulus.v + (long)iVar13 * 4);
      *puVar2 = *puVar2 | uVar57 << 0x1e;
    }
    psVar42 = &sStack_378;
    if (iStack_394 == 0x18) goto LAB_001537de;
    iVar20 = (int)psVar54;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x15363a;
    psVar41 = psVar54;
    psVar61 = psVar42;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar42,iVar20,
                        (secp256k1_modinv32_signed30 *)psVar32,-1);
    if (iVar13 < 1) goto LAB_001537e3;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x153655;
    psVar41 = psVar54;
    psVar61 = psVar42;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar42,iVar20,
                        (secp256k1_modinv32_signed30 *)psVar32,1);
    if (0 < iVar13) goto LAB_001537e8;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x153670;
    psVar41 = psVar54;
    psVar61 = &sStack_338;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_338,iVar20,
                        (secp256k1_modinv32_signed30 *)psVar32,-1);
    if (iVar13 < 1) goto LAB_001537ed;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x15368b;
    psVar41 = psVar54;
    psVar61 = &sStack_338;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_338,iVar20,
                        (secp256k1_modinv32_signed30 *)psVar32,1);
    if (-1 < iVar13) goto LAB_001537f2;
    iStack_394 = iStack_394 + 1;
    psStack_390 = psVar54;
    goto LAB_00153380;
  }
LAB_001537c5:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1537ca;
  secp256k1_modinv32_var_cold_8();
  psVar32 = psVar31;
LAB_001537ca:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1537cf;
  secp256k1_modinv32_var_cold_19();
LAB_001537cf:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1537d4;
  secp256k1_modinv32_var_cold_18();
LAB_001537d4:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1537d9;
  secp256k1_modinv32_var_cold_17();
LAB_001537d9:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1537de;
  secp256k1_modinv32_var_cold_16();
LAB_001537de:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1537e3;
  secp256k1_modinv32_var_cold_13();
LAB_001537e3:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1537e8;
  secp256k1_modinv32_var_cold_12();
LAB_001537e8:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1537ed;
  secp256k1_modinv32_var_cold_11();
LAB_001537ed:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1537f2;
  secp256k1_modinv32_var_cold_10();
LAB_001537f2:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1537f7;
  secp256k1_modinv32_var_cold_9();
  psVar31 = psVar54;
LAB_001537f7:
  psVar54 = psVar42;
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1537fc;
  secp256k1_modinv32_var_cold_14();
LAB_001537fc:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)secp256k1_modinv32;
  secp256k1_modinv32_var_cold_15();
  psStack_3a0 = &sStack_338;
  psStack_3a8 = psVar54;
  psStack_3b0 = psVar31;
  psStack_3b8 = (secp256k1_modinv64_modinfo *)pcVar59;
  uStack_3c0 = uVar47;
  psStack_3c8 = psVar32;
  auStack_410._16_8_ = 0;
  auStack_410._24_8_ = 0;
  auStack_410._0_8_ = 0;
  auStack_410._8_8_ = 0;
  auStack_410._32_4_ = 0;
  uStack_3d8 = 0;
  uStack_3d0 = 0;
  uStack_3e8 = 0;
  uStack_3e0 = 0;
  auStack_410._36_4_ = 1;
  sStack_480.modulus.v[4]._0_4_ = (int32_t)(psVar41->modulus).v[4];
  sStack_480.modulus.v[2] = (psVar41->modulus).v[2];
  sStack_480.modulus.v[3] = (psVar41->modulus).v[3];
  sStack_480.modulus.v[0] = (psVar41->modulus).v[0];
  sStack_480.modulus.v[1] = (psVar41->modulus).v[1];
  sStack_440.modulus.v[4]._0_4_ = (int32_t)(psVar61->modulus).v[4];
  sStack_440.modulus.v[0] = (psVar61->modulus).v[0];
  sStack_440.modulus.v[1] = (psVar61->modulus).v[1];
  sStack_480.modulus_inv62 = (uint64_t)psVar61;
  sStack_440.modulus.v[2] = (psVar61->modulus).v[2];
  sStack_440.modulus.v[3] = (psVar61->modulus).v[3];
  iVar13 = 0;
  uVar47 = 0xffffffff;
  psStack_4a8 = psVar41;
  do {
    uStack_448 = (ulong)(int)(uint)sStack_480.modulus.v[0];
    uVar48 = (ulong)(int)(uint)sStack_440.modulus.v[0];
    uVar49 = 0;
    psVar42 = (secp256k1_modinv64_modinfo *)0x1;
    uVar12 = 0;
    uVar14 = 0;
    uVar53 = 1;
    uVar57 = (uint)sStack_440.modulus.v[0];
    uVar39 = (uint)sStack_480.modulus.v[0];
    do {
      uVar19 = (uint)sStack_480.modulus.v[0];
      iStack_49c = iVar13;
      if ((uVar39 & 1) == 0) {
        psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153cbf;
        secp256k1_modinv32_cold_17();
LAB_00153cbf:
        psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153cc4;
        secp256k1_modinv32_cold_1();
LAB_00153cc4:
        psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153cc9;
        secp256k1_modinv32_cold_2();
        psVar61 = (secp256k1_modinv64_modinfo *)pcVar59;
LAB_00153cc9:
        uVar53 = uVar19;
        psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153cce;
        secp256k1_modinv32_cold_16();
        goto LAB_00153cce;
      }
      uVar28 = (uint)psVar42;
      uVar40 = uVar12 * (uint)sStack_440.modulus.v[0] + uVar28 * (uint)sStack_480.modulus.v[0];
      psVar31 = (secp256k1_modinv64_modinfo *)(ulong)uVar40;
      uVar58 = uVar39 << ((byte)uVar49 & 0x1f);
      psVar32 = (secp256k1_modinv64_modinfo *)(ulong)uVar58;
      if (uVar40 != uVar58) goto LAB_00153cbf;
      uVar40 = uVar53 * (uint)sStack_440.modulus.v[0] + uVar14 * (uint)sStack_480.modulus.v[0];
      psVar31 = (secp256k1_modinv64_modinfo *)(ulong)uVar40;
      uVar58 = uVar57 << ((byte)uVar49 & 0x1f);
      psVar32 = (secp256k1_modinv64_modinfo *)(ulong)uVar58;
      if (uVar40 != uVar58) goto LAB_00153cc4;
      uStack_494 = (int)(uint)uVar47 >> 0x1f;
      psVar31 = (secp256k1_modinv64_modinfo *)(ulong)uStack_494;
      uStack_498 = uVar57 & 1;
      uVar58 = -uStack_498;
      psVar54 = (secp256k1_modinv64_modinfo *)(ulong)uVar58;
      uVar40 = uStack_494 & uVar58;
      psVar32 = (secp256k1_modinv64_modinfo *)(ulong)uVar40;
      uVar65 = (uint)uVar47 ^ uVar40;
      uVar47 = (ulong)uVar65;
      psVar61 = (secp256k1_modinv64_modinfo *)(ulong)(uVar65 - 0x25b);
      if (uVar65 - 0x25b < 0xfffffb4d) goto LAB_00153cc9;
      uVar47 = (ulong)(uVar65 - 1);
      uVar53 = uVar53 + ((uStack_494 ^ uVar12) - uStack_494 & uVar58);
      uVar12 = (uVar12 + (uVar53 & uVar40)) * 2;
      uVar14 = uVar14 + ((uStack_494 ^ uVar28) - uStack_494 & uVar58);
      uVar19 = (uVar28 + (uVar14 & uVar40)) * 2;
      psVar42 = (secp256k1_modinv64_modinfo *)(ulong)uVar19;
      uVar58 = ((uStack_494 ^ uVar39) - uStack_494 & uVar58) + uVar57;
      uVar57 = uVar58 >> 1;
      uVar58 = uVar58 & uVar40;
      pcVar59 = (code *)(ulong)uVar58;
      uVar39 = uVar39 + uVar58;
      uVar58 = (int)uVar49 + 1;
      uVar49 = (ulong)uVar58;
    } while (uVar58 != 0x1e);
    psVar31 = (secp256k1_modinv64_modinfo *)(long)(int)uVar19;
    psVar61 = (secp256k1_modinv64_modinfo *)(long)(int)uVar12;
    psVar54 = (secp256k1_modinv64_modinfo *)(long)(int)uVar14;
    uVar49 = (long)psVar31 * (long)(int)uVar53 - (long)psVar61 * (long)psVar54;
    sStack_490.u = uVar19;
    sStack_490.v = uVar12;
    sStack_490.q = uVar14;
    sStack_490.r = uVar53;
    if (uVar49 != 0x40000000) {
LAB_00153cce:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153cd3;
      secp256k1_modinv32_cold_3();
LAB_00153cd3:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153cd8;
      secp256k1_modinv32_cold_15();
LAB_00153cd8:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153cdd;
      secp256k1_modinv32_cold_14();
LAB_00153cdd:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153ce2;
      secp256k1_modinv32_cold_13();
LAB_00153ce2:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153ce7;
      secp256k1_modinv32_cold_12();
LAB_00153ce7:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153cec;
      secp256k1_modinv32_cold_4();
LAB_00153cec:
      pcVar59 = (code *)psVar61;
      uVar12 = (uint)uVar49;
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153cf1;
      secp256k1_modinv32_cold_5();
LAB_00153cf1:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153cf6;
      secp256k1_modinv32_cold_11();
LAB_00153cf6:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153cfb;
      secp256k1_modinv32_cold_10();
LAB_00153cfb:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153d00;
      secp256k1_modinv32_cold_9();
LAB_00153d00:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153d05;
      secp256k1_modinv32_cold_8();
      goto LAB_00153d05;
    }
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x1539f3;
    lStack_450 = (long)(int)uVar53;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)auStack_410,
               (secp256k1_modinv32_signed30 *)(auStack_410 + 0x24),&sStack_490,
               (secp256k1_modinv32_modinfo *)psStack_4a8);
    psVar32 = &sStack_480;
    uVar53 = 9;
    uVar49 = 0xffffffff;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153a0f;
    psVar42 = psVar32;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar32,9,
                        (secp256k1_modinv32_signed30 *)psStack_4a8,-1);
    if (iVar13 < 1) goto LAB_00153cd3;
    uVar53 = 9;
    uVar49 = 1;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153a2e;
    psVar42 = psVar32;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar32,9,
                        (secp256k1_modinv32_signed30 *)psStack_4a8,1);
    if (0 < iVar13) goto LAB_00153cd8;
    psVar32 = &sStack_440;
    uVar53 = 9;
    uVar49 = 0xffffffff;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153a52;
    psVar42 = psVar32;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar32,9,
                        (secp256k1_modinv32_signed30 *)psStack_4a8,-1);
    if (iVar13 < 1) goto LAB_00153cdd;
    uVar53 = 9;
    uVar49 = 1;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153a71;
    psVar42 = psVar32;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar32,9,
                        (secp256k1_modinv32_signed30 *)psStack_4a8,1);
    pcVar59 = (code *)psStack_4a8;
    if (-1 < iVar13) goto LAB_00153ce2;
    psVar32 = (secp256k1_modinv64_modinfo *)((long)psVar61 * uVar48 + (long)psVar31 * uStack_448);
    uVar49 = uStack_448;
    if (((ulong)psVar32 & 0x3ffffffe) != 0) goto LAB_00153ce7;
    uVar49 = uStack_448 * (long)psVar54;
    uVar48 = uVar48 * lStack_450 + uVar49;
    if ((uVar48 & 0x3fffffff) != 0) goto LAB_00153cec;
    uVar48 = (long)uVar48 >> 0x1e;
    psVar32 = (secp256k1_modinv64_modinfo *)((long)psVar32 >> 0x1e);
    lVar17 = 1;
    do {
      lVar22 = (long)*(int *)((long)sStack_480.modulus.v + lVar17 * 4);
      lVar24 = (long)*(int *)((long)sStack_440.modulus.v + lVar17 * 4);
      lVar26 = (long)(psVar32->modulus).v + lVar24 * (long)psVar61 + lVar22 * (long)psVar31;
      lVar22 = lVar24 * lStack_450 + lVar22 * (long)psVar54 + uVar48;
      *(uint *)((long)sStack_480.modulus.v + lVar17 * 4 + -4) = (uint)lVar26 & 0x3fffffff;
      *(uint *)((long)&uStack_448 + lVar17 * 4 + 4) = (uint)lVar22 & 0x3fffffff;
      lVar17 = lVar17 + 1;
      uVar48 = lVar22 >> 0x1e;
      psVar32 = (secp256k1_modinv64_modinfo *)(lVar26 >> 0x1e);
    } while (lVar17 != 9);
    sStack_440.modulus.v[4]._0_4_ = (int32_t)uVar48;
    psVar31 = &sStack_480;
    uVar53 = 9;
    uVar12 = 0xffffffff;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153b43;
    psVar42 = psVar31;
    sStack_480.modulus.v[4]._0_4_ = (int32_t)psVar32;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar31,9,
                        (secp256k1_modinv32_signed30 *)psStack_4a8,-1);
    if (iVar13 < 1) goto LAB_00153cf1;
    uVar53 = 9;
    uVar12 = 1;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153b60;
    psVar42 = psVar31;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar31,9,
                        (secp256k1_modinv32_signed30 *)pcVar59,1);
    if (0 < iVar13) goto LAB_00153cf6;
    psVar31 = &sStack_440;
    uVar53 = 9;
    uVar12 = 0xffffffff;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153b82;
    psVar42 = psVar31;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar31,9,
                        (secp256k1_modinv32_signed30 *)pcVar59,-1);
    if (iVar13 < 1) goto LAB_00153cfb;
    uVar53 = 9;
    uVar12 = 1;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153b9f;
    psVar42 = psVar31;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar31,9,
                        (secp256k1_modinv32_signed30 *)pcVar59,1);
    if (-1 < iVar13) goto LAB_00153d00;
    iVar13 = iStack_49c + 1;
  } while (iVar13 != 0x14);
  psVar42 = &sStack_440;
  uVar53 = 9;
  uVar12 = 0;
  psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153bce;
  iVar13 = secp256k1_modinv32_mul_cmp_30
                     ((secp256k1_modinv32_signed30 *)psVar42,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar13 == 0) {
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153bf1;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_480,9,&SECP256K1_SIGNED30_ONE,-1);
    psVar31 = (secp256k1_modinv64_modinfo *)sStack_480.modulus_inv62;
    if (iVar13 == 0) {
LAB_00153c79:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153c8e;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)auStack_410,(int32_t)psVar32,
                 (secp256k1_modinv32_modinfo *)pcVar59);
      *(undefined4 *)((psVar31->modulus).v + 4) = auStack_410._32_4_;
      (psVar31->modulus).v[2] = auStack_410._16_8_;
      (psVar31->modulus).v[3] = auStack_410._24_8_;
      (psVar31->modulus).v[0] = auStack_410._0_8_;
      (psVar31->modulus).v[1] = auStack_410._8_8_;
      return;
    }
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153c15;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_480,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar13 == 0) goto LAB_00153c79;
    uVar53 = 9;
    uVar12 = 0;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153c2f;
    psVar42 = psVar31;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar31,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar13 == 0) {
      psVar42 = (secp256k1_modinv64_modinfo *)auStack_410;
      uVar53 = 9;
      uVar12 = 0;
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153c52;
      iVar13 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar42,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar13 == 0) {
        psVar42 = &sStack_480;
        uVar53 = 9;
        uVar12 = 1;
        psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153c71;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar42,9,
                            (secp256k1_modinv32_signed30 *)pcVar59,1);
        if (iVar13 == 0) goto LAB_00153c79;
      }
    }
  }
  else {
LAB_00153d05:
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x153d0a;
    secp256k1_modinv32_cold_6();
  }
  psStack_4b8 = (secp256k1_modinv64_modinfo *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  a_01 = &sStack_508;
  piVar33 = (int *)(ulong)uVar12;
  pcStack_510 = (code *)0x153d2f;
  psStack_4c0 = psVar32;
  psStack_4b8 = psVar31;
  secp256k1_modinv32_mul_30(&sStack_4e4,(secp256k1_modinv32_signed30 *)psVar42,uVar53,1);
  pcStack_510 = (code *)0x153d41;
  piVar52 = piVar33;
  psVar36 = a_00;
  secp256k1_modinv32_mul_30(&sStack_508,a_00,9,uVar12);
  lVar17 = 0;
  while ((uint)sStack_4e4.v[lVar17] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_508.v[lVar17]) goto LAB_00153d93;
    lVar17 = lVar17 + 1;
    if (lVar17 == 8) {
      uVar12 = 8;
      while( true ) {
        if (sStack_4e4.v[uVar12] < sStack_508.v[uVar12]) {
          return;
        }
        if (sStack_508.v[uVar12] < sStack_4e4.v[uVar12]) break;
        bVar68 = uVar12 == 0;
        uVar12 = uVar12 - 1;
        if (bVar68) {
          return;
        }
      }
      return;
    }
  }
  pcStack_510 = (code *)0x153d93;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_00153d93:
  pcStack_510 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar13 = (int)a_01;
  piStack_538 = piVar33;
  uStack_530 = uVar47;
  psStack_528 = (secp256k1_modinv64_modinfo *)pcVar59;
  psStack_518 = psVar54;
  pcStack_510 = (code *)uVar48;
  if (iVar13 < 1) {
    psStack_548 = (secp256k1_modinv32_signed30 *)0x153e86;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_00153e86:
    iVar21 = (int)piVar52;
    psStack_548 = (secp256k1_modinv32_signed30 *)0x153e8b;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar20 = piVar52[1];
    iVar4 = *piVar52;
    piVar33 = (int *)(long)psVar36->v[0];
    uVar49 = (long)*extraout_RDX * (long)iVar20 + (long)piVar33 * (long)iVar4;
    if ((uVar49 & 0x3fffffff) != 0) goto LAB_00153e86;
    iVar5 = piVar52[3];
    iVar21 = piVar52[2];
    piVar33 = (int *)((long)piVar33 * (long)iVar21);
    piVar52 = (int *)((long)*extraout_RDX * (long)iVar5 + (long)piVar33);
    if (((ulong)piVar52 & 0x3fffffff) == 0) {
      lVar22 = (long)piVar52 >> 0x1e;
      lVar17 = (long)uVar49 >> 0x1e;
      if (iVar13 != 1) {
        uVar47 = 1;
        do {
          lVar17 = (long)extraout_RDX[uVar47] * (long)iVar20 +
                   (long)psVar36->v[uVar47] * (long)iVar4 + lVar17;
          lVar22 = (long)extraout_RDX[uVar47] * (long)iVar5 +
                   (long)psVar36->v[uVar47] * (long)iVar21 + lVar22;
          psVar36->v[uVar47 - 1] = (uint)lVar17 & 0x3fffffff;
          extraout_RDX[uVar47 - 1] = (uint)lVar22 & 0x3fffffff;
          uVar47 = uVar47 + 1;
          lVar22 = lVar22 >> 0x1e;
          lVar17 = lVar17 >> 0x1e;
        } while (((ulong)a_01 & 0xffffffff) != uVar47);
      }
      psVar36->v[(long)iVar13 + -1] = (int32_t)lVar17;
      extraout_RDX[(long)iVar13 + -1] = (int)lVar22;
      return;
    }
  }
  psStack_548 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar17 = 0;
  psStack_548 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar17 < extraout_EDX) {
      psStack_548 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_548->v + (long)psVar36->v[lVar17] * (long)iVar21);
    }
    a_01->v[lVar17] = (uint)psStack_548 & 0x3fffffff;
    psStack_548 = (secp256k1_modinv32_signed30 *)((long)psStack_548 >> 0x1e);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 8);
  if (8 < extraout_EDX) {
    psStack_548 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_548->v + (long)psVar36->v[8] * (long)iVar21);
  }
  b = (secp256k1_modinv32_signed30 *)(long)(int)psStack_548;
  if (b == psStack_548) {
    a_01->v[8] = (int)psStack_548;
    return;
  }
  pcStack_550 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar12 = *extraout_RDX_00;
  psVar62 = (secp256k1_modinv32_signed30 *)(long)(int)uVar12;
  uVar57 = extraout_RDX_00[1];
  lVar17 = (long)(int)uVar57;
  uVar39 = extraout_RDX_00[2];
  psVar34 = (secp256k1_modinv32_signed30 *)(long)(int)uVar39;
  lStack_588 = (long)(int)extraout_RDX_00[3];
  psVar37 = (secp256k1_fe *)0x9;
  pcStack_598 = (code *)0x153f25;
  a_02 = a_01;
  piStack_578 = piVar33;
  uStack_570 = uVar47;
  psStack_568 = (secp256k1_modinv64_modinfo *)pcVar59;
  psStack_558 = psVar54;
  pcStack_550 = (code *)uVar48;
  iVar13 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
  if (iVar13 < 1) {
    pcStack_598 = (code *)0x15418d;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_0015418d:
    pcStack_598 = (code *)0x154192;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_00154192:
    pcStack_598 = (code *)0x154197;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_00154197:
    pcStack_598 = (code *)0x15419c;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0015419c:
    pcStack_598 = (code *)0x1541a1;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_001541a1:
    pcStack_598 = (code *)0x1541a6;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_001541a6:
    pcStack_598 = (code *)0x1541ab;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_001541ab:
    pcStack_598 = (code *)0x1541b0;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar56 = b;
LAB_001541b0:
    pcStack_598 = (code *)0x1541b5;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_001541b5:
    pcStack_598 = (code *)0x1541ba;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_001541ba:
    pcStack_598 = (code *)0x1541bf;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar37 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x153f42;
    a_02 = a_01;
    iVar13 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar13) goto LAB_0015418d;
    psVar37 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x153f5f;
    a_02 = psVar36;
    iVar13 = secp256k1_modinv32_mul_cmp_30(psVar36,9,b,-2);
    if (iVar13 < 1) goto LAB_00154192;
    psVar37 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x153f7c;
    a_02 = psVar36;
    iVar13 = secp256k1_modinv32_mul_cmp_30(psVar36,9,b,1);
    if (-1 < iVar13) goto LAB_00154197;
    psVar56 = (secp256k1_modinv32_signed30 *)-(long)psVar62;
    if (0 < (long)psVar62) {
      psVar56 = psVar62;
    }
    lVar22 = -lVar17;
    if (lVar17 < 1) {
      lVar22 = lVar17;
    }
    if (lVar22 + 0x40000000 < (long)psVar56) goto LAB_0015419c;
    psVar56 = (secp256k1_modinv32_signed30 *)-(long)psVar34;
    if (0 < (long)psVar34) {
      psVar56 = psVar34;
    }
    lVar22 = -lStack_588;
    if (lStack_588 < 1) {
      lVar22 = lStack_588;
    }
    if (lVar22 + 0x40000000 < (long)psVar56) goto LAB_001541a1;
    uVar53 = a_01->v[8] >> 0x1f;
    uVar14 = psVar36->v[8] >> 0x1f;
    psVar37 = (secp256k1_fe *)(ulong)uVar14;
    iVar13 = (uVar14 & uVar57) + (uVar53 & uVar12);
    a_02 = (secp256k1_modinv32_signed30 *)
           (psVar36->v[0] * lVar17 + (long)a_01->v[0] * (long)psVar62);
    lVar22 = (long)(int)(iVar13 - ((int)a_02 * b[1].v[0] + iVar13 & 0x3fffffffU));
    piVar25 = (int32_t *)((long)a_02->v + lVar22 * b->v[0]);
    if (((ulong)piVar25 & 0x3fffffff) != 0) goto LAB_001541a6;
    lStack_580 = lVar22;
    iVar13 = (uVar14 & (uint)lStack_588) + (uVar53 & uVar39);
    lVar24 = psVar36->v[0] * lStack_588 + (long)a_01->v[0] * (long)psVar34;
    a_02 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar12 = iVar13 - (b[1].v[0] * (int)lVar24 + iVar13 & 0x3fffffffU);
    psVar37 = (secp256k1_fe *)(ulong)uVar12;
    uVar47 = (long)b->v[0] * (long)(int)uVar12 + lVar24;
    if ((uVar47 & 0x3fffffff) != 0) goto LAB_001541ab;
    lVar24 = (long)uVar47 >> 0x1e;
    lVar26 = (long)piVar25 >> 0x1e;
    lVar43 = 1;
    do {
      lVar26 = b->v[lVar43] * lVar22 + psVar36->v[lVar43] * lVar17 +
               (long)a_01->v[lVar43] * (long)psVar62 + lVar26;
      psVar56 = (secp256k1_modinv32_signed30 *)(psVar36->v[lVar43] * lStack_588);
      lVar24 = (long)psVar56->v +
               (long)a_01->v[lVar43] * (long)psVar34 + lVar24 +
               (long)b->v[lVar43] * (long)(int)uVar12;
      a_01->v[lVar43 + -1] = (uint)lVar26 & 0x3fffffff;
      psVar36->v[lVar43 + -1] = (uint)lVar24 & 0x3fffffff;
      lVar43 = lVar43 + 1;
      lVar24 = lVar24 >> 0x1e;
      lVar26 = lVar26 >> 0x1e;
    } while (lVar43 != 9);
    a_01->v[8] = (int32_t)lVar26;
    psVar36->v[8] = (int32_t)lVar24;
    psVar37 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x154126;
    a_02 = a_01;
    iVar13 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
    psVar34 = psVar36;
    psVar62 = b;
    if (iVar13 < 1) goto LAB_001541b0;
    psVar37 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x154143;
    a_02 = a_01;
    iVar13 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar13) goto LAB_001541b5;
    psVar37 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x15415c;
    a_02 = psVar36;
    iVar13 = secp256k1_modinv32_mul_cmp_30(psVar36,9,b,-2);
    if (iVar13 < 1) goto LAB_001541ba;
    psVar37 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x154175;
    a_02 = psVar36;
    iVar13 = secp256k1_modinv32_mul_cmp_30(psVar36,9,b,1);
    if (iVar13 < 0) {
      return;
    }
  }
  pcStack_598 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_598 = (code *)lVar17;
  psStack_5a0 = a_01;
  psStack_5a8 = psVar36;
  psStack_5b0 = psVar62;
  psStack_5b8 = psVar56;
  psStack_5c0 = psVar34;
  uVar12 = a_02->v[0];
  uVar38 = (ulong)uVar12;
  uVar57 = a_02->v[3];
  uVar50 = (ulong)uVar57;
  uVar39 = a_02->v[4];
  uVar49 = (ulong)uVar39;
  uVar14 = a_02->v[5];
  uVar48 = (ulong)uVar14;
  psVar36 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_02->v[6];
  uVar53 = a_02->v[7];
  uVar47 = (ulong)uVar53;
  iStack_5c4 = a_02->v[8];
  lVar17 = 0;
  do {
    if (a_02->v[lVar17] < -0x3fffffff) {
      pcStack_600 = (code *)0x15450d;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0015450d:
      pcStack_600 = (code *)0x154512;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_00154512;
    }
    if (0x3fffffff < a_02->v[lVar17]) goto LAB_0015450d;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 9);
  uStack_5e4 = (uint)psVar37;
  psVar37 = (secp256k1_fe *)0x9;
  pcStack_600 = (code *)0x15424a;
  psVar36 = a_02;
  uStack_5f0 = a_02->v[1];
  uStack_5ec = a_02->v[2];
  uStack_5e8 = a_02->v[6];
  psStack_5e0 = b_00;
  iVar13 = secp256k1_modinv32_mul_cmp_30(a_02,9,b_00,-2);
  if (iVar13 < 1) {
LAB_00154512:
    pcStack_600 = (code *)0x154517;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_00154517:
    pcStack_600 = (code *)0x15451c;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0015451c:
    pcStack_600 = (code *)0x154521;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_00154521:
    pcStack_600 = (code *)0x154526;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar37 = (secp256k1_fe *)0x9;
    pcStack_600 = (code *)0x154269;
    psVar36 = a_02;
    iVar13 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_5e0,1);
    if (-1 < iVar13) goto LAB_00154517;
    uVar19 = iStack_5c4 >> 0x1f;
    uStack_5c8 = psStack_5e0->v[1];
    uVar58 = (uVar19 & uStack_5c8) + uStack_5f0;
    uStack_5f0 = psStack_5e0->v[2];
    uVar28 = (uVar19 & uStack_5f0) + uStack_5ec;
    uStack_5ec = psStack_5e0->v[3];
    uStack_5cc = psStack_5e0->v[4];
    uStack_5d0 = psStack_5e0->v[5];
    uStack_5d4 = psStack_5e0->v[6];
    uVar29 = (uVar19 & uStack_5d4) + uStack_5e8;
    uStack_5e8 = psStack_5e0->v[7];
    uStack_5f4 = (int)uStack_5e4 >> 0x1f;
    uStack_5e4 = psStack_5e0->v[8];
    uVar65 = ((uVar19 & psStack_5e0->v[0]) + uVar12 ^ uStack_5f4) - uStack_5f4;
    uVar40 = ((int)uVar65 >> 0x1e) + ((uVar58 ^ uStack_5f4) - uStack_5f4);
    uVar58 = ((int)uVar40 >> 0x1e) + ((uVar28 ^ uStack_5f4) - uStack_5f4);
    uVar66 = ((int)uVar58 >> 0x1e) + (((uVar19 & uStack_5ec) + uVar57 ^ uStack_5f4) - uStack_5f4);
    uVar57 = ((int)uVar66 >> 0x1e) + (((uVar19 & uStack_5cc) + uVar39 ^ uStack_5f4) - uStack_5f4);
    uVar12 = ((int)uVar57 >> 0x1e) + (((uVar19 & uStack_5d0) + uVar14 ^ uStack_5f4) - uStack_5f4);
    uVar39 = ((int)uVar12 >> 0x1e) + ((uVar29 ^ uStack_5f4) - uStack_5f4);
    uVar14 = ((int)uVar39 >> 0x1e) + (((uVar19 & uStack_5e8) + uVar53 ^ uStack_5f4) - uStack_5f4);
    uVar63 = ((int)uVar14 >> 0x1e) +
             (((uVar19 & uStack_5e4) + iStack_5c4 ^ uStack_5f4) - uStack_5f4);
    uVar48 = (ulong)uVar63;
    uStack_5f8 = (int)uVar63 >> 0x1f;
    uVar29 = (psStack_5e0->v[0] & uStack_5f8) + (uVar65 & 0x3fffffff);
    uVar28 = (uStack_5d0 & uStack_5f8) + (uVar12 & 0x3fffffff);
    uVar38 = (ulong)uVar28;
    uVar65 = (uStack_5d4 & uStack_5f8) + (uVar39 & 0x3fffffff);
    uVar50 = (ulong)uVar65;
    uVar12 = ((int)uVar29 >> 0x1e) + (uStack_5c8 & uStack_5f8) + (uVar40 & 0x3fffffff);
    uVar39 = ((int)uVar12 >> 0x1e) + (uStack_5f0 & uStack_5f8) + (uVar58 & 0x3fffffff);
    uVar53 = ((int)uVar39 >> 0x1e) + (uStack_5ec & uStack_5f8) + (uVar66 & 0x3fffffff);
    uVar19 = ((int)uVar53 >> 0x1e) + (uStack_5cc & uStack_5f8) + (uVar57 & 0x3fffffff);
    uVar28 = ((int)uVar19 >> 0x1e) + uVar28;
    uVar65 = ((int)uVar28 >> 0x1e) + uVar65;
    uVar57 = ((int)uVar65 >> 0x1e) + (uStack_5e8 & uStack_5f8) + (uVar14 & 0x3fffffff);
    uVar14 = ((int)uVar57 >> 0x1e) + (uStack_5e4 & uStack_5f8) + uVar63;
    uVar49 = (ulong)uVar14;
    uVar53 = uVar53 & 0x3fffffff;
    psVar37 = (secp256k1_fe *)(ulong)uVar53;
    uVar19 = uVar19 & 0x3fffffff;
    psVar36 = (secp256k1_modinv32_signed30 *)(ulong)uVar19;
    uVar57 = uVar57 & 0x3fffffff;
    uVar47 = (ulong)uVar57;
    a_02->v[0] = uVar29 & 0x3fffffff;
    a_02->v[1] = uVar12 & 0x3fffffff;
    a_02->v[2] = uVar39 & 0x3fffffff;
    a_02->v[3] = uVar53;
    a_02->v[4] = uVar19;
    a_02->v[5] = uVar28 & 0x3fffffff;
    a_02->v[6] = uVar65 & 0x3fffffff;
    a_02->v[7] = uVar57;
    a_02->v[8] = uVar14;
    if (0x3fffffff < uVar14) goto LAB_0015451c;
    psVar37 = (secp256k1_fe *)0x9;
    pcStack_600 = (code *)0x1544da;
    psVar36 = a_02;
    iVar13 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_5e0,0);
    if (iVar13 < 0) goto LAB_00154521;
    psVar37 = (secp256k1_fe *)0x9;
    pcStack_600 = (code *)0x1544f5;
    psVar36 = a_02;
    iVar13 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_5e0,1);
    if (iVar13 < 0) {
      return;
    }
  }
  pcStack_600 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  psStack_698 = (secp256k1_fe *)secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    psStack_698 = (secp256k1_fe *)secp256k1_fe_inv;
  }
  pcStack_6e8 = (code *)0x154562;
  uStack_628 = uVar47;
  uStack_620 = uVar48;
  uStack_618 = uVar50;
  psStack_610 = a_02;
  uStack_608 = uVar38;
  pcStack_600 = (code *)uVar49;
  (*(code *)psStack_698)(&sStack_6d0);
  if (psVar36 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar36->v + 8) = sStack_6d0.n[4];
    *(ulong *)(psVar36[1].v + 1) = CONCAT44(sStack_6d0.normalized,sStack_6d0.magnitude);
    *(uint64_t *)(psVar36->v + 4) = sStack_6d0.n[2];
    *(uint64_t *)(psVar36->v + 6) = sStack_6d0.n[3];
    *(uint64_t *)psVar36->v = sStack_6d0.n[0];
    *(uint64_t *)(psVar36->v + 2) = sStack_6d0.n[1];
  }
  uVar67 = 0xfffffffffffff;
  uVar16 = 0xf000000000000;
  uVar49 = 0xffffffffffff;
  uVar48 = 0x1000003d0;
  sStack_660.n[0] = psVar37->n[0];
  sStack_660.n[1] = psVar37->n[1];
  sStack_660.n[2] = psVar37->n[2];
  sStack_660.n[3] = psVar37->n[3];
  sStack_660.n[4] = psVar37->n[4];
  sStack_660.magnitude = psVar37->magnitude;
  sStack_660.normalized = psVar37->normalized;
  a_03 = &sStack_660;
  pcStack_6e8 = (code *)0x1545d9;
  secp256k1_fe_verify(a_03);
  lStack_6d8 = 0x1000003d1;
  uVar47 = (sStack_660.n[4] >> 0x30) * 0x1000003d1 + sStack_660.n[0];
  if (((uVar47 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar47 & 0xfffffffffffff) == 0)) {
    uVar50 = (uVar47 >> 0x34) + sStack_660.n[1];
    uVar38 = (uVar50 >> 0x34) + sStack_660.n[2];
    uVar44 = (uVar38 >> 0x34) + sStack_660.n[3];
    uVar46 = (uVar44 >> 0x34) + (sStack_660.n[4] & 0xffffffffffff);
    if ((((uVar50 | uVar47 | uVar38 | uVar44) & 0xfffffffffffff) != 0 || uVar46 != 0) &&
       (((uVar47 | 0x1000003d0) & uVar50 & uVar38 & uVar44 & (uVar46 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0015467c;
LAB_00154a90:
    psVar37 = &sStack_6d0;
    pcStack_6e8 = (code *)0x154a9d;
    secp256k1_fe_verify(psVar37);
    uVar49 = uVar49 & sStack_6d0.n[4];
    uVar47 = (sStack_6d0.n[4] >> 0x30) * lStack_6d8 + sStack_6d0.n[0];
    uVar50 = (uVar47 >> 0x34) + sStack_6d0.n[1];
    uVar38 = (uVar50 >> 0x34) + sStack_6d0.n[2];
    r = (secp256k1_fe *)((uVar38 >> 0x34) + sStack_6d0.n[3]);
    uVar44 = ((ulong)r >> 0x34) + uVar49;
    if ((((uVar50 | uVar47 | uVar38 | (ulong)r) & uVar67) == 0 && uVar44 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar44 ^ uVar16),
       ((uVar47 ^ uVar48) & uVar50 & uVar38 & (ulong)r & (ulong)r_00) == uVar67)) {
      return;
    }
  }
  else {
LAB_0015467c:
    pcStack_6e8 = (code *)0x154694;
    r = psVar37;
    secp256k1_fe_mul(&sStack_660,psVar37,&sStack_6d0);
    pcStack_6e8 = (code *)0x15469c;
    secp256k1_fe_verify(&sStack_660);
    r_00 = &fe_minus_one;
    pcStack_6e8 = (code *)0x1546a8;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_660.magnitude < 0x20) {
      sStack_660.n[0] = sStack_660.n[0] + 0xffffefffffc2e;
      sStack_660.n[1] = sStack_660.n[1] + 0xfffffffffffff;
      sStack_660.n[2] = sStack_660.n[2] + 0xfffffffffffff;
      sStack_660.n[3] = sStack_660.n[3] + 0xfffffffffffff;
      sStack_660.n[4] = sStack_660.n[4] + 0xffffffffffff;
      sStack_660.normalized = 0;
      sStack_660.magnitude = sStack_660.magnitude + 1;
      pcStack_6e8 = (code *)0x1546fd;
      secp256k1_fe_verify(&sStack_660);
      pcStack_6e8 = (code *)0x154705;
      secp256k1_fe_verify(&sStack_660);
      uVar47 = (sStack_660.n[4] >> 0x30) * lStack_6d8 + sStack_660.n[0];
      uVar49 = (uVar47 >> 0x34) + sStack_660.n[1];
      uVar50 = (uVar49 >> 0x34) + sStack_660.n[2];
      r = (secp256k1_fe *)((uVar50 >> 0x34) + sStack_660.n[3]);
      uVar38 = ((ulong)r >> 0x34) + (sStack_660.n[4] & 0xffffffffffff);
      if ((((uVar49 | uVar47 | uVar50 | (ulong)r) & 0xfffffffffffff) != 0 || uVar38 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar38 ^ 0xf000000000000),
         ((uVar47 ^ 0x1000003d0) & uVar49 & uVar50 & (ulong)r & (ulong)r_00) != 0xfffffffffffff))
      goto LAB_00154b1e;
      sStack_690.n[0] = psVar37->n[0];
      sStack_690.n[1] = psVar37->n[1];
      sStack_690.n[2] = psVar37->n[2];
      sStack_690.n[3] = psVar37->n[3];
      sStack_690.n[4] = psVar37->n[4];
      sStack_690.magnitude = psVar37->magnitude;
      sStack_690.normalized = psVar37->normalized;
      psVar37 = &sStack_690;
      pcStack_6e8 = (code *)0x15479d;
      secp256k1_fe_verify(psVar37);
      r_00 = &fe_minus_one;
      pcStack_6e8 = (code *)0x1547a9;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_690.magnitude) goto LAB_00154b23;
      uVar35 = sStack_690.n[0] + 0xffffefffffc2e;
      uVar64 = sStack_690.n[1] + 0xfffffffffffff;
      uVar67 = sStack_690.n[2] + 0xfffffffffffff;
      uVar16 = sStack_690.n[3] + 0xfffffffffffff;
      uVar48 = sStack_690.n[4] + 0xffffffffffff;
      sStack_690.normalized = 0;
      sStack_690.magnitude = sStack_690.magnitude + 1;
      pcStack_6e8 = (code *)0x15481e;
      sStack_690.n[0] = uVar35;
      sStack_690.n[1] = uVar64;
      sStack_690.n[2] = uVar67;
      sStack_690.n[3] = uVar16;
      sStack_690.n[4] = uVar48;
      secp256k1_fe_verify(&sStack_690);
      pcStack_6e8 = (code *)0x154826;
      secp256k1_fe_verify(&sStack_690);
      a_03 = psStack_698;
      uVar47 = (uVar48 >> 0x30) * lStack_6d8 + uVar35;
      if (((uVar47 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar47 & 0xfffffffffffff) == 0)) {
        uVar48 = uVar48 & 0xffffffffffff;
        uVar44 = uVar64 + (uVar47 >> 0x34);
        uVar49 = (uVar44 >> 0x34) + uVar67;
        uVar50 = (uVar49 >> 0x34) + uVar16;
        uVar38 = (uVar50 >> 0x34) + uVar48;
        if (((uVar44 | uVar47 | uVar49 | uVar50) & 0xfffffffffffff) == 0 && uVar38 == 0) {
          return;
        }
        if (((uVar47 | 0x1000003d0) & uVar44 & uVar49 & uVar50 & (uVar38 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      r = &sStack_690;
      pcStack_6e8 = (code *)0x1548e6;
      (*(code *)psStack_698)();
      psVar37 = &sStack_6d0;
      pcStack_6e8 = (code *)0x1548f3;
      secp256k1_fe_verify(psVar37);
      r_00 = &fe_minus_one;
      pcStack_6e8 = (code *)0x1548ff;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_6d0.magnitude) goto LAB_00154b28;
      psVar37 = &sStack_6d0;
      sStack_6d0.n[0] = sStack_6d0.n[0] + 0xffffefffffc2e;
      sStack_6d0.n[1] = sStack_6d0.n[1] + 0xfffffffffffff;
      sStack_6d0.n[2] = sStack_6d0.n[2] + 0xfffffffffffff;
      sStack_6d0.n[3] = sStack_6d0.n[3] + 0xfffffffffffff;
      sStack_6d0.n[4] = sStack_6d0.n[4] + 0xffffffffffff;
      sStack_6d0.magnitude = sStack_6d0.magnitude + 1;
      uVar49 = 0;
      sStack_6d0.normalized = 0;
      pcStack_6e8 = (code *)0x154948;
      secp256k1_fe_verify(psVar37);
      pcStack_6e8 = (code *)0x154951;
      r = psVar37;
      (*(code *)a_03)(psVar37);
      pcStack_6e8 = (code *)0x154959;
      secp256k1_fe_verify(psVar37);
      sStack_6d0.n[0] = sStack_6d0.n[0] + 1;
      sStack_6d0.magnitude = sStack_6d0.magnitude + 1;
      sStack_6d0.normalized = 0;
      pcStack_6e8 = (code *)0x15496a;
      secp256k1_fe_verify(psVar37);
      pcStack_6e8 = (code *)0x154972;
      secp256k1_fe_verify(psVar37);
      a_03 = &sStack_690;
      pcStack_6e8 = (code *)0x15497f;
      r_00 = a_03;
      secp256k1_fe_verify(a_03);
      if (sStack_690.magnitude + sStack_6d0.magnitude < 0x21) {
        sStack_6d0.n[0] = sStack_6d0.n[0] + sStack_690.n[0];
        sStack_6d0.n[1] = sStack_6d0.n[1] + sStack_690.n[1];
        sStack_6d0.n[2] = sStack_6d0.n[2] + sStack_690.n[2];
        sStack_6d0.n[3] = sStack_6d0.n[3] + sStack_690.n[3];
        sStack_6d0.n[4] = sStack_6d0.n[4] + sStack_690.n[4];
        sStack_6d0.normalized = 0;
        pcStack_6e8 = (code *)0x1549cd;
        sStack_6d0.magnitude = sStack_690.magnitude + sStack_6d0.magnitude;
        secp256k1_fe_verify(&sStack_6d0);
        pcStack_6e8 = (code *)0x1549d5;
        secp256k1_fe_verify(&sStack_6d0);
        uVar47 = (sStack_6d0.n[4] >> 0x30) * lStack_6d8 + sStack_6d0.n[0];
        if (((uVar47 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar47 & 0xfffffffffffff) == 0)) {
          uVar50 = (uVar47 >> 0x34) + sStack_6d0.n[1];
          uVar38 = (uVar50 >> 0x34) + sStack_6d0.n[2];
          uVar44 = (uVar38 >> 0x34) + sStack_6d0.n[3];
          uVar46 = (uVar44 >> 0x34) + (sStack_6d0.n[4] & 0xffffffffffff);
          if (((uVar50 | uVar47 | uVar38 | uVar44) & 0xfffffffffffff) == 0 && uVar46 == 0) {
            return;
          }
          if (((uVar47 | 0x1000003d0) & uVar50 & uVar38 & uVar44 & (uVar46 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_6e8 = (code *)0x154a90;
        test_inverse_field_cold_2();
        goto LAB_00154a90;
      }
    }
    else {
      pcStack_6e8 = (code *)0x154b1e;
      test_inverse_field_cold_7();
LAB_00154b1e:
      pcStack_6e8 = (code *)0x154b23;
      test_inverse_field_cold_6();
LAB_00154b23:
      a_03 = &sStack_660;
      pcStack_6e8 = (code *)0x154b28;
      test_inverse_field_cold_5();
LAB_00154b28:
      uVar49 = 0xffffffffffff;
      pcStack_6e8 = (code *)0x154b2d;
      test_inverse_field_cold_4();
    }
    pcStack_6e8 = (code *)0x154b32;
    test_inverse_field_cold_3();
  }
  pcStack_6e8 = test_inverse_scalar;
  test_inverse_field_cold_1();
  psVar45 = (secp256k1_fe *)auStack_758;
  pcVar59 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar59 = secp256k1_scalar_inverse;
  }
  pcStack_760 = (code *)0x154b60;
  auStack_718._32_8_ = psVar37;
  auStack_718._40_8_ = a_03;
  pcStack_6e8 = (code *)uVar67;
  (*pcVar59)(auStack_758);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_758._20_4_,auStack_758._16_4_);
    r_00->n[3] = CONCAT44(auStack_758._28_4_,auStack_758._24_4_);
    r_00->n[0] = CONCAT44(auStack_758._4_4_,auStack_758._0_4_);
    r_00->n[1] = CONCAT44(auStack_758._12_4_,auStack_758._8_4_);
  }
  pcStack_760 = (code *)0x154b7f;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar69._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar69._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar69._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar69._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar13 = movmskps(extraout_EAX,auVar69);
  if (iVar13 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_718;
    pcStack_760 = (code *)0x154bb3;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_758);
    pcStack_760 = (code *)0x154bbb;
    psVar37 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_718._0_8_ != 1 || auStack_718._8_8_ != 0) || auStack_718._16_8_ != 0) ||
        auStack_718._24_8_ != 0) {
      pcStack_760 = (code *)0x154cc5;
      test_inverse_scalar_cold_1();
      goto LAB_00154cc5;
    }
    pcStack_760 = (code *)0x154beb;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_758 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_760 = (code *)0x154bf3;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_758 + 0x20));
    auVar70._0_4_ = -(uint)(iStack_728 == 0 && auStack_758._32_4_ == 0);
    auVar70._4_4_ = -(uint)(iStack_724 == 0 && iStack_734 == 0);
    auVar70._8_4_ = -(uint)(iStack_720 == 0 && iStack_730 == 0);
    auVar70._12_4_ = -(uint)(iStack_71c == 0 && iStack_72c == 0);
    iVar13 = movmskps(extraout_EAX_00,auVar70);
    if (iVar13 == 0xf) {
      return;
    }
    a = (secp256k1_scalar *)(auStack_758 + 0x20);
    pcStack_760 = (code *)0x154c24;
    (*pcVar59)(a,a);
    pcStack_760 = (code *)0x154c39;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_758,&scalar_minus_one,(secp256k1_scalar *)auStack_758);
    pcStack_760 = (code *)0x154c42;
    (*pcVar59)(auStack_758,auStack_758);
    pcStack_760 = (code *)0x154c54;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_758,(secp256k1_scalar *)auStack_758,&secp256k1_scalar_one
              );
    pcStack_760 = (code *)0x154c62;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_758,a,(secp256k1_scalar *)auStack_758);
    pcStack_760 = (code *)0x154c6a;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_758);
    auVar71._0_4_ = -(uint)(auStack_758._16_4_ == 0 && auStack_758._0_4_ == 0);
    auVar71._4_4_ = -(uint)(auStack_758._20_4_ == 0 && auStack_758._4_4_ == 0);
    auVar71._8_4_ = -(uint)(auStack_758._24_4_ == 0 && auStack_758._8_4_ == 0);
    auVar71._12_4_ = -(uint)(auStack_758._28_4_ == 0 && auStack_758._12_4_ == 0);
    iVar13 = movmskps(extraout_EAX_01,auVar71);
    if (iVar13 == 0xf) {
      return;
    }
    pcStack_760 = (code *)0x154c8e;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_758;
  }
  pcStack_760 = (code *)0x154c99;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_758);
  auVar72._0_4_ = -(uint)(auStack_758._16_4_ == 0 && auStack_758._0_4_ == 0);
  auVar72._4_4_ = -(uint)(auStack_758._20_4_ == 0 && auStack_758._4_4_ == 0);
  auVar72._8_4_ = -(uint)(auStack_758._24_4_ == 0 && auStack_758._8_4_ == 0);
  auVar72._12_4_ = -(uint)(auStack_758._28_4_ == 0 && auStack_758._12_4_ == 0);
  iVar13 = movmskps(extraout_EAX_02,auVar72);
  r = (secp256k1_fe *)auStack_758;
  psVar37 = psVar45;
  if (iVar13 == 0xf) {
    return;
  }
LAB_00154cc5:
  pcStack_760 = test_hsort;
  test_inverse_scalar_cold_3();
  __s = auStack_1810;
  psStack_788 = r;
  uStack_780 = uVar48;
  uStack_778 = uVar16;
  psStack_770 = r_00;
  pcStack_768 = pcVar59;
  pcStack_760 = (code *)uVar49;
  memset(__s,0,0x1081);
  uStack_1820 = 0;
  lVar17 = 0x41;
  psStack_1818 = psVar37;
  secp256k1_hsort(__s,0x41,(size_t)psVar37,test_hsort_cmp,&uStack_1820);
  if (0x3f < uStack_1820) {
    test_hsort_is_sorted(auStack_1810,0x41,(size_t)psVar37);
    if (0 < COUNT) {
      iVar13 = 0;
      do {
        uVar15 = testrand_int(0x41);
        count = (size_t)(int)uVar15;
        testrand_bytes_test(auStack_1810,count * (long)psVar37);
        secp256k1_hsort(auStack_1810,count,(size_t)psVar37,test_hsort_cmp,&uStack_1820);
        test_hsort_is_sorted(auStack_1810,count,(size_t)psVar37);
        iVar13 = iVar13 + 1;
      } while (iVar13 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX_01 = *extraout_RDX_01 + 1;
  if (extraout_RDX_01[1] != 0) {
    lVar22 = 0;
    do {
      if (__s[lVar22] != *(uchar *)(lVar17 + lVar22)) {
        return;
      }
      lVar22 = lVar22 + 1;
    } while (extraout_RDX_01[1] != lVar22);
  }
  return;
LAB_001528a1:
  pcStack_f0 = (code *)0x1528a6;
  test_modinv32_uint16_cold_5();
LAB_001528a6:
  pcStack_f0 = (code *)0x1528ab;
  test_modinv32_uint16_cold_3();
LAB_001528ab:
  pcStack_f0 = (code *)0x1528b0;
  test_modinv32_uint16_cold_1();
  psVar61 = psVar54;
LAB_001528b0:
  psVar42 = psVar61;
  pcStack_f0 = (code *)0x1528b5;
  test_modinv32_uint16_cold_6();
  goto LAB_001528b5;
LAB_00152e3c:
  pcStack_1d8 = (code *)0x152e41;
  test_modinv64_uint16_cold_5();
  goto LAB_00152e41;
}

Assistant:

static void test_modinv32_uint16(uint16_t* out, const uint16_t* in, const uint16_t* mod) {
    uint16_t tmp[16];
    secp256k1_modinv32_signed30 x;
    secp256k1_modinv32_modinfo m;
    int i, vartime, nonzero;

    uint16_to_signed30(&x, in);
    nonzero = (x.v[0] | x.v[1] | x.v[2] | x.v[3] | x.v[4] | x.v[5] | x.v[6] | x.v[7] | x.v[8]) != 0;
    uint16_to_signed30(&m.modulus, mod);

    /* compute 1/modulus mod 2^30 */
    m.modulus_inv30 = modinv2p64(m.modulus.v[0]) & 0x3fffffff;
    CHECK(((m.modulus_inv30 * m.modulus.v[0]) & 0x3fffffff) == 1);

    /* Test secp256k1_jacobi32_maybe_var. */
    if (nonzero) {
        int jac;
        uint16_t sqr[16], negone[16];
        mulmod256(sqr, in, in, mod);
        uint16_to_signed30(&x, sqr);
        /* Compute jacobi symbol of in^2, which must be 1 (or uncomputable). */
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1);
        /* Then compute the jacobi symbol of -(in^2). x and -x have opposite
         * jacobi symbols if and only if (mod % 4) == 3. */
        negone[0] = mod[0] - 1;
        for (i = 1; i < 16; ++i) negone[i] = mod[i];
        mulmod256(sqr, sqr, negone, mod);
        uint16_to_signed30(&x, sqr);
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1 - (mod[0] & 2));
    }

    uint16_to_signed30(&x, in);
    mutate_sign_signed30(&m.modulus);
    for (vartime = 0; vartime < 2; ++vartime) {
        /* compute inverse */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* produce output */
        signed30_to_uint16(out, &x);

        /* check if the inverse times the input is 1 (mod m), unless x is 0. */
        mulmod256(tmp, out, in, mod);
        CHECK(tmp[0] == nonzero);
        for (i = 1; i < 16; ++i) CHECK(tmp[i] == 0);

        /* invert again */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* check if the result is equal to the input */
        signed30_to_uint16(tmp, &x);
        for (i = 0; i < 16; ++i) CHECK(tmp[i] == in[i]);
    }
}